

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Occluded1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  Primitive PVar16;
  int iVar17;
  Geometry *pGVar18;
  __int_type_conflict _Var19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined6 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  int iVar52;
  ulong uVar53;
  long lVar54;
  RTCFilterFunctionN p_Var55;
  RTCRayN *pRVar56;
  undefined4 uVar57;
  RTCIntersectArguments *pRVar58;
  undefined1 *puVar59;
  ulong uVar60;
  Geometry *pGVar61;
  Geometry *geometry;
  long lVar62;
  ulong uVar63;
  ulong uVar64;
  bool bVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  uint uVar69;
  uint uVar70;
  uint uVar71;
  short sVar72;
  undefined2 uVar105;
  float fVar73;
  float fVar106;
  float fVar108;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar79 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar74;
  float fVar107;
  float fVar109;
  float fVar110;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar133;
  float fVar136;
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar134;
  float fVar135;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar141;
  float fVar147;
  float fVar148;
  vfloat4 v;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar149;
  float fVar150;
  float fVar160;
  float fVar162;
  vfloat4 v_1;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  float fVar161;
  float fVar163;
  float fVar164;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar165;
  float fVar176;
  float fVar177;
  undefined1 auVar166 [16];
  float fVar178;
  float fVar179;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  float fVar180;
  float fVar203;
  float fVar204;
  undefined1 auVar181 [16];
  undefined1 auVar184 [16];
  undefined1 auVar187 [16];
  undefined1 auVar190 [16];
  undefined1 auVar193 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar211;
  float fVar214;
  undefined1 auVar208 [16];
  float fVar212;
  float fVar213;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar228;
  float fVar231;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar226 [16];
  float fVar229;
  float fVar230;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  undefined1 auVar227 [16];
  float fVar236;
  float fVar240;
  float fVar241;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar242;
  float fVar249;
  float fVar250;
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar251;
  float fVar252;
  float fVar257;
  float fVar258;
  float fVar259;
  float fVar260;
  undefined1 auVar253 [16];
  undefined1 auVar256 [16];
  float fVar261;
  float fVar262;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar272;
  float fVar281;
  float fVar282;
  float fVar283;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar291;
  float fVar293;
  float fVar295;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  float fVar292;
  float fVar294;
  float fVar296;
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  bool local_4f9;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_438;
  undefined8 uStack_430;
  float local_418;
  float fStack_414;
  float fStack_410;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  ulong local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined8 *local_308;
  Precalculations *local_300;
  RTCFilterFunctionNArguments local_2f8;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  LinearSpace3fa *local_248;
  Primitive *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  uint local_208;
  int local_204;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined1 local_1b8 [16];
  float local_1a8 [4];
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188 [4];
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 uVar104;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  
  PVar16 = prim[1];
  uVar53 = (ulong)(byte)PVar16;
  lVar22 = uVar53 * 0x25;
  pPVar7 = prim + lVar22 + 6;
  fVar148 = *(float *)(pPVar7 + 0xc);
  fVar149 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar148;
  fVar160 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar148;
  fVar162 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar148;
  fVar141 = *(float *)(ray + k * 4 + 0x40) * fVar148;
  fVar147 = *(float *)(ray + k * 4 + 0x50) * fVar148;
  fVar148 = *(float *)(ray + k * 4 + 0x60) * fVar148;
  uVar57 = *(undefined4 *)(prim + uVar53 * 4 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar247._8_4_ = 0;
  auVar247._0_8_ = uVar64;
  auVar247._12_2_ = uVar105;
  auVar247._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar143._12_4_ = auVar247._12_4_;
  auVar143._8_2_ = 0;
  auVar143._0_8_ = uVar64;
  auVar143._10_2_ = uVar105;
  auVar75._10_6_ = auVar143._10_6_;
  auVar75._8_2_ = uVar105;
  auVar75._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar27._4_8_ = auVar75._8_8_;
  auVar27._2_2_ = uVar105;
  auVar27._0_2_ = uVar105;
  fVar284 = (float)((int)sVar72 >> 8);
  fVar291 = (float)(auVar27._0_4_ >> 0x18);
  fVar293 = (float)(auVar75._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar53 * 5 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar116._8_4_ = 0;
  auVar116._0_8_ = uVar64;
  auVar116._12_2_ = uVar105;
  auVar116._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar115._12_4_ = auVar116._12_4_;
  auVar115._8_2_ = 0;
  auVar115._0_8_ = uVar64;
  auVar115._10_2_ = uVar105;
  auVar114._10_6_ = auVar115._10_6_;
  auVar114._8_2_ = uVar105;
  auVar114._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar28._4_8_ = auVar114._8_8_;
  auVar28._2_2_ = uVar105;
  auVar28._0_2_ = uVar105;
  fVar165 = (float)((int)sVar72 >> 8);
  fVar176 = (float)(auVar28._0_4_ >> 0x18);
  fVar177 = (float)(auVar114._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar53 * 6 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar119._8_4_ = 0;
  auVar119._0_8_ = uVar64;
  auVar119._12_2_ = uVar105;
  auVar119._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar118._12_4_ = auVar119._12_4_;
  auVar118._8_2_ = 0;
  auVar118._0_8_ = uVar64;
  auVar118._10_2_ = uVar105;
  auVar117._10_6_ = auVar118._10_6_;
  auVar117._8_2_ = uVar105;
  auVar117._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar29._4_8_ = auVar117._8_8_;
  auVar29._2_2_ = uVar105;
  auVar29._0_2_ = uVar105;
  fVar205 = (float)((int)sVar72 >> 8);
  fVar211 = (float)(auVar29._0_4_ >> 0x18);
  fVar214 = (float)(auVar117._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar53 * 0xf + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar122._8_4_ = 0;
  auVar122._0_8_ = uVar64;
  auVar122._12_2_ = uVar105;
  auVar122._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar121._12_4_ = auVar122._12_4_;
  auVar121._8_2_ = 0;
  auVar121._0_8_ = uVar64;
  auVar121._10_2_ = uVar105;
  auVar120._10_6_ = auVar121._10_6_;
  auVar120._8_2_ = uVar105;
  auVar120._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar30._4_8_ = auVar120._8_8_;
  auVar30._2_2_ = uVar105;
  auVar30._0_2_ = uVar105;
  fVar73 = (float)((int)sVar72 >> 8);
  fVar106 = (float)(auVar30._0_4_ >> 0x18);
  fVar108 = (float)(auVar120._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar183._8_4_ = 0;
  auVar183._0_8_ = uVar64;
  auVar183._12_2_ = uVar105;
  auVar183._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar182._12_4_ = auVar183._12_4_;
  auVar182._8_2_ = 0;
  auVar182._0_8_ = uVar64;
  auVar182._10_2_ = uVar105;
  auVar181._10_6_ = auVar182._10_6_;
  auVar181._8_2_ = uVar105;
  auVar181._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar31._4_8_ = auVar181._8_8_;
  auVar31._2_2_ = uVar105;
  auVar31._0_2_ = uVar105;
  fVar219 = (float)((int)sVar72 >> 8);
  fVar228 = (float)(auVar31._0_4_ >> 0x18);
  fVar231 = (float)(auVar181._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + (ulong)(byte)PVar16 * 0x10 + uVar53 + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar186._8_4_ = 0;
  auVar186._0_8_ = uVar64;
  auVar186._12_2_ = uVar105;
  auVar186._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar185._12_4_ = auVar186._12_4_;
  auVar185._8_2_ = 0;
  auVar185._0_8_ = uVar64;
  auVar185._10_2_ = uVar105;
  auVar184._10_6_ = auVar185._10_6_;
  auVar184._8_2_ = uVar105;
  auVar184._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar32._4_8_ = auVar184._8_8_;
  auVar32._2_2_ = uVar105;
  auVar32._0_2_ = uVar105;
  fVar242 = (float)((int)sVar72 >> 8);
  fVar249 = (float)(auVar32._0_4_ >> 0x18);
  fVar250 = (float)(auVar184._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar53 * 0x1a + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar189._8_4_ = 0;
  auVar189._0_8_ = uVar64;
  auVar189._12_2_ = uVar105;
  auVar189._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar188._12_4_ = auVar189._12_4_;
  auVar188._8_2_ = 0;
  auVar188._0_8_ = uVar64;
  auVar188._10_2_ = uVar105;
  auVar187._10_6_ = auVar188._10_6_;
  auVar187._8_2_ = uVar105;
  auVar187._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar33._4_8_ = auVar187._8_8_;
  auVar33._2_2_ = uVar105;
  auVar33._0_2_ = uVar105;
  fVar236 = (float)((int)sVar72 >> 8);
  fVar240 = (float)(auVar33._0_4_ >> 0x18);
  fVar241 = (float)(auVar187._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar53 * 0x1b + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar192._8_4_ = 0;
  auVar192._0_8_ = uVar64;
  auVar192._12_2_ = uVar105;
  auVar192._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar191._12_4_ = auVar192._12_4_;
  auVar191._8_2_ = 0;
  auVar191._0_8_ = uVar64;
  auVar191._10_2_ = uVar105;
  auVar190._10_6_ = auVar191._10_6_;
  auVar190._8_2_ = uVar105;
  auVar190._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar34._4_8_ = auVar190._8_8_;
  auVar34._2_2_ = uVar105;
  auVar34._0_2_ = uVar105;
  fVar251 = (float)((int)sVar72 >> 8);
  fVar257 = (float)(auVar34._0_4_ >> 0x18);
  fVar259 = (float)(auVar190._8_4_ >> 0x18);
  uVar57 = *(undefined4 *)(prim + uVar53 * 0x1c + 6);
  uVar104 = (undefined1)((uint)uVar57 >> 0x18);
  uVar105 = CONCAT11(uVar104,uVar104);
  uVar104 = (undefined1)((uint)uVar57 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar105,uVar104),CONCAT14(uVar104,uVar57));
  uVar104 = (undefined1)((uint)uVar57 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar104),uVar104);
  sVar72 = CONCAT11((char)uVar57,(char)uVar57);
  uVar64 = CONCAT62(uVar26,sVar72);
  auVar195._8_4_ = 0;
  auVar195._0_8_ = uVar64;
  auVar195._12_2_ = uVar105;
  auVar195._14_2_ = uVar105;
  uVar105 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar194._12_4_ = auVar195._12_4_;
  auVar194._8_2_ = 0;
  auVar194._0_8_ = uVar64;
  auVar194._10_2_ = uVar105;
  auVar193._10_6_ = auVar194._10_6_;
  auVar193._8_2_ = uVar105;
  auVar193._0_8_ = uVar64;
  uVar105 = (undefined2)uVar26;
  auVar35._4_8_ = auVar193._8_8_;
  auVar35._2_2_ = uVar105;
  auVar35._0_2_ = uVar105;
  fVar111 = (float)((int)sVar72 >> 8);
  fVar133 = (float)(auVar35._0_4_ >> 0x18);
  fVar136 = (float)(auVar193._8_4_ >> 0x18);
  fVar272 = fVar141 * fVar284 + fVar147 * fVar165 + fVar148 * fVar205;
  fVar281 = fVar141 * fVar291 + fVar147 * fVar176 + fVar148 * fVar211;
  fVar282 = fVar141 * fVar293 + fVar147 * fVar177 + fVar148 * fVar214;
  fVar283 = fVar141 * (float)(auVar143._12_4_ >> 0x18) +
            fVar147 * (float)(auVar115._12_4_ >> 0x18) + fVar148 * (float)(auVar118._12_4_ >> 0x18);
  fVar262 = fVar141 * fVar73 + fVar147 * fVar219 + fVar148 * fVar242;
  fVar269 = fVar141 * fVar106 + fVar147 * fVar228 + fVar148 * fVar249;
  fVar270 = fVar141 * fVar108 + fVar147 * fVar231 + fVar148 * fVar250;
  fVar271 = fVar141 * (float)(auVar121._12_4_ >> 0x18) +
            fVar147 * (float)(auVar182._12_4_ >> 0x18) + fVar148 * (float)(auVar185._12_4_ >> 0x18);
  fVar180 = fVar141 * fVar236 + fVar147 * fVar251 + fVar148 * fVar111;
  fVar203 = fVar141 * fVar240 + fVar147 * fVar257 + fVar148 * fVar133;
  fVar204 = fVar141 * fVar241 + fVar147 * fVar259 + fVar148 * fVar136;
  fVar141 = fVar141 * (float)(auVar188._12_4_ >> 0x18) +
            fVar147 * (float)(auVar191._12_4_ >> 0x18) + fVar148 * (float)(auVar194._12_4_ >> 0x18);
  fVar285 = fVar284 * fVar149 + fVar165 * fVar160 + fVar205 * fVar162;
  fVar291 = fVar291 * fVar149 + fVar176 * fVar160 + fVar211 * fVar162;
  fVar293 = fVar293 * fVar149 + fVar177 * fVar160 + fVar214 * fVar162;
  fVar295 = (float)(auVar143._12_4_ >> 0x18) * fVar149 +
            (float)(auVar115._12_4_ >> 0x18) * fVar160 + (float)(auVar118._12_4_ >> 0x18) * fVar162;
  fVar242 = fVar73 * fVar149 + fVar219 * fVar160 + fVar242 * fVar162;
  fVar249 = fVar106 * fVar149 + fVar228 * fVar160 + fVar249 * fVar162;
  fVar250 = fVar108 * fVar149 + fVar231 * fVar160 + fVar250 * fVar162;
  fVar284 = (float)(auVar121._12_4_ >> 0x18) * fVar149 +
            (float)(auVar182._12_4_ >> 0x18) * fVar160 + (float)(auVar185._12_4_ >> 0x18) * fVar162;
  fVar236 = fVar149 * fVar236 + fVar160 * fVar251 + fVar162 * fVar111;
  fVar240 = fVar149 * fVar240 + fVar160 * fVar257 + fVar162 * fVar133;
  fVar241 = fVar149 * fVar241 + fVar160 * fVar259 + fVar162 * fVar136;
  fVar251 = fVar149 * (float)(auVar188._12_4_ >> 0x18) +
            fVar160 * (float)(auVar191._12_4_ >> 0x18) + fVar162 * (float)(auVar194._12_4_ >> 0x18);
  fVar148 = (float)DAT_01ff1d40;
  fVar73 = DAT_01ff1d40._4_4_;
  fVar106 = DAT_01ff1d40._8_4_;
  fVar108 = DAT_01ff1d40._12_4_;
  uVar66 = -(uint)(fVar148 <= ABS(fVar272));
  uVar67 = -(uint)(fVar73 <= ABS(fVar281));
  uVar68 = -(uint)(fVar106 <= ABS(fVar282));
  uVar69 = -(uint)(fVar108 <= ABS(fVar283));
  auVar273._0_4_ = (uint)fVar272 & uVar66;
  auVar273._4_4_ = (uint)fVar281 & uVar67;
  auVar273._8_4_ = (uint)fVar282 & uVar68;
  auVar273._12_4_ = (uint)fVar283 & uVar69;
  auVar151._0_4_ = ~uVar66 & (uint)fVar148;
  auVar151._4_4_ = ~uVar67 & (uint)fVar73;
  auVar151._8_4_ = ~uVar68 & (uint)fVar106;
  auVar151._12_4_ = ~uVar69 & (uint)fVar108;
  auVar151 = auVar151 | auVar273;
  uVar66 = -(uint)(fVar148 <= ABS(fVar262));
  uVar67 = -(uint)(fVar73 <= ABS(fVar269));
  uVar68 = -(uint)(fVar106 <= ABS(fVar270));
  uVar69 = -(uint)(fVar108 <= ABS(fVar271));
  auVar263._0_4_ = (uint)fVar262 & uVar66;
  auVar263._4_4_ = (uint)fVar269 & uVar67;
  auVar263._8_4_ = (uint)fVar270 & uVar68;
  auVar263._12_4_ = (uint)fVar271 & uVar69;
  auVar208._0_4_ = ~uVar66 & (uint)fVar148;
  auVar208._4_4_ = ~uVar67 & (uint)fVar73;
  auVar208._8_4_ = ~uVar68 & (uint)fVar106;
  auVar208._12_4_ = ~uVar69 & (uint)fVar108;
  auVar208 = auVar208 | auVar263;
  uVar66 = -(uint)(fVar148 <= ABS(fVar180));
  uVar67 = -(uint)(fVar73 <= ABS(fVar203));
  uVar68 = -(uint)(fVar106 <= ABS(fVar204));
  uVar69 = -(uint)(fVar108 <= ABS(fVar141));
  auVar196._0_4_ = (uint)fVar180 & uVar66;
  auVar196._4_4_ = (uint)fVar203 & uVar67;
  auVar196._8_4_ = (uint)fVar204 & uVar68;
  auVar196._12_4_ = (uint)fVar141 & uVar69;
  auVar222._0_4_ = ~uVar66 & (uint)fVar148;
  auVar222._4_4_ = ~uVar67 & (uint)fVar73;
  auVar222._8_4_ = ~uVar68 & (uint)fVar106;
  auVar222._12_4_ = ~uVar69 & (uint)fVar108;
  auVar222 = auVar222 | auVar196;
  auVar75 = rcpps(_DAT_01ff1d40,auVar151);
  fVar148 = auVar75._0_4_;
  fVar108 = auVar75._4_4_;
  fVar165 = auVar75._8_4_;
  fVar219 = auVar75._12_4_;
  fVar148 = (1.0 - auVar151._0_4_ * fVar148) * fVar148 + fVar148;
  fVar108 = (1.0 - auVar151._4_4_ * fVar108) * fVar108 + fVar108;
  fVar165 = (1.0 - auVar151._8_4_ * fVar165) * fVar165 + fVar165;
  fVar219 = (1.0 - auVar151._12_4_ * fVar219) * fVar219 + fVar219;
  auVar75 = rcpps(auVar75,auVar208);
  fVar73 = auVar75._0_4_;
  fVar111 = auVar75._4_4_;
  fVar176 = auVar75._8_4_;
  fVar228 = auVar75._12_4_;
  fVar73 = (1.0 - auVar208._0_4_ * fVar73) * fVar73 + fVar73;
  fVar111 = (1.0 - auVar208._4_4_ * fVar111) * fVar111 + fVar111;
  fVar176 = (1.0 - auVar208._8_4_ * fVar176) * fVar176 + fVar176;
  fVar228 = (1.0 - auVar208._12_4_ * fVar228) * fVar228 + fVar228;
  auVar75 = rcpps(auVar75,auVar222);
  fVar106 = auVar75._0_4_;
  fVar133 = auVar75._4_4_;
  fVar177 = auVar75._8_4_;
  fVar231 = auVar75._12_4_;
  fVar106 = (1.0 - auVar222._0_4_ * fVar106) * fVar106 + fVar106;
  fVar133 = (1.0 - auVar222._4_4_ * fVar133) * fVar133 + fVar133;
  fVar177 = (1.0 - auVar222._8_4_ * fVar177) * fVar177 + fVar177;
  fVar231 = (1.0 - auVar222._12_4_ * fVar231) * fVar231 + fVar231;
  fVar257 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar22 + 0x16)) *
            *(float *)(prim + lVar22 + 0x1a);
  uVar64 = *(ulong *)(prim + uVar53 * 7 + 6);
  uVar105 = (undefined2)(uVar64 >> 0x30);
  auVar78._8_4_ = 0;
  auVar78._0_8_ = uVar64;
  auVar78._12_2_ = uVar105;
  auVar78._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar64 >> 0x20);
  auVar77._12_4_ = auVar78._12_4_;
  auVar77._8_2_ = 0;
  auVar77._0_8_ = uVar64;
  auVar77._10_2_ = uVar105;
  auVar76._10_6_ = auVar77._10_6_;
  auVar76._8_2_ = uVar105;
  auVar76._0_8_ = uVar64;
  uVar105 = (undefined2)(uVar64 >> 0x10);
  auVar36._4_8_ = auVar76._8_8_;
  auVar36._2_2_ = uVar105;
  auVar36._0_2_ = uVar105;
  fVar136 = (float)(auVar36._0_4_ >> 0x10);
  fVar180 = (float)(auVar76._8_4_ >> 0x10);
  uVar63 = *(ulong *)(prim + uVar53 * 0xb + 6);
  uVar105 = (undefined2)(uVar63 >> 0x30);
  auVar154._8_4_ = 0;
  auVar154._0_8_ = uVar63;
  auVar154._12_2_ = uVar105;
  auVar154._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar63 >> 0x20);
  auVar153._12_4_ = auVar154._12_4_;
  auVar153._8_2_ = 0;
  auVar153._0_8_ = uVar63;
  auVar153._10_2_ = uVar105;
  auVar152._10_6_ = auVar153._10_6_;
  auVar152._8_2_ = uVar105;
  auVar152._0_8_ = uVar63;
  uVar105 = (undefined2)(uVar63 >> 0x10);
  auVar37._4_8_ = auVar152._8_8_;
  auVar37._2_2_ = uVar105;
  auVar37._0_2_ = uVar105;
  uVar8 = *(ulong *)(prim + uVar53 * 9 + 6);
  uVar105 = (undefined2)(uVar8 >> 0x30);
  auVar81._8_4_ = 0;
  auVar81._0_8_ = uVar8;
  auVar81._12_2_ = uVar105;
  auVar81._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar8 >> 0x20);
  auVar80._12_4_ = auVar81._12_4_;
  auVar80._8_2_ = 0;
  auVar80._0_8_ = uVar8;
  auVar80._10_2_ = uVar105;
  auVar79._10_6_ = auVar80._10_6_;
  auVar79._8_2_ = uVar105;
  auVar79._0_8_ = uVar8;
  uVar105 = (undefined2)(uVar8 >> 0x10);
  auVar38._4_8_ = auVar79._8_8_;
  auVar38._2_2_ = uVar105;
  auVar38._0_2_ = uVar105;
  fVar141 = (float)(auVar38._0_4_ >> 0x10);
  fVar203 = (float)(auVar79._8_4_ >> 0x10);
  uVar9 = *(ulong *)(prim + uVar53 * 0xd + 6);
  uVar105 = (undefined2)(uVar9 >> 0x30);
  auVar225._8_4_ = 0;
  auVar225._0_8_ = uVar9;
  auVar225._12_2_ = uVar105;
  auVar225._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar9 >> 0x20);
  auVar224._12_4_ = auVar225._12_4_;
  auVar224._8_2_ = 0;
  auVar224._0_8_ = uVar9;
  auVar224._10_2_ = uVar105;
  auVar223._10_6_ = auVar224._10_6_;
  auVar223._8_2_ = uVar105;
  auVar223._0_8_ = uVar9;
  uVar105 = (undefined2)(uVar9 >> 0x10);
  auVar39._4_8_ = auVar223._8_8_;
  auVar39._2_2_ = uVar105;
  auVar39._0_2_ = uVar105;
  uVar10 = *(ulong *)(prim + uVar53 * 0x12 + 6);
  uVar105 = (undefined2)(uVar10 >> 0x30);
  auVar84._8_4_ = 0;
  auVar84._0_8_ = uVar10;
  auVar84._12_2_ = uVar105;
  auVar84._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar10 >> 0x20);
  auVar83._12_4_ = auVar84._12_4_;
  auVar83._8_2_ = 0;
  auVar83._0_8_ = uVar10;
  auVar83._10_2_ = uVar105;
  auVar82._10_6_ = auVar83._10_6_;
  auVar82._8_2_ = uVar105;
  auVar82._0_8_ = uVar10;
  uVar105 = (undefined2)(uVar10 >> 0x10);
  auVar40._4_8_ = auVar82._8_8_;
  auVar40._2_2_ = uVar105;
  auVar40._0_2_ = uVar105;
  fVar147 = (float)(auVar40._0_4_ >> 0x10);
  fVar204 = (float)(auVar82._8_4_ >> 0x10);
  uVar60 = (ulong)(uint)((int)(uVar53 * 5) << 2);
  uVar11 = *(ulong *)(prim + uVar53 * 2 + uVar60 + 6);
  uVar105 = (undefined2)(uVar11 >> 0x30);
  auVar245._8_4_ = 0;
  auVar245._0_8_ = uVar11;
  auVar245._12_2_ = uVar105;
  auVar245._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar11 >> 0x20);
  auVar244._12_4_ = auVar245._12_4_;
  auVar244._8_2_ = 0;
  auVar244._0_8_ = uVar11;
  auVar244._10_2_ = uVar105;
  auVar243._10_6_ = auVar244._10_6_;
  auVar243._8_2_ = uVar105;
  auVar243._0_8_ = uVar11;
  uVar105 = (undefined2)(uVar11 >> 0x10);
  auVar41._4_8_ = auVar243._8_8_;
  auVar41._2_2_ = uVar105;
  auVar41._0_2_ = uVar105;
  uVar60 = *(ulong *)(prim + uVar60 + 6);
  uVar105 = (undefined2)(uVar60 >> 0x30);
  auVar87._8_4_ = 0;
  auVar87._0_8_ = uVar60;
  auVar87._12_2_ = uVar105;
  auVar87._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar60 >> 0x20);
  auVar86._12_4_ = auVar87._12_4_;
  auVar86._8_2_ = 0;
  auVar86._0_8_ = uVar60;
  auVar86._10_2_ = uVar105;
  auVar85._10_6_ = auVar86._10_6_;
  auVar85._8_2_ = uVar105;
  auVar85._0_8_ = uVar60;
  uVar105 = (undefined2)(uVar60 >> 0x10);
  auVar42._4_8_ = auVar85._8_8_;
  auVar42._2_2_ = uVar105;
  auVar42._0_2_ = uVar105;
  fVar149 = (float)(auVar42._0_4_ >> 0x10);
  fVar205 = (float)(auVar85._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar53 * 0x18 + 6);
  uVar105 = (undefined2)(uVar12 >> 0x30);
  auVar255._8_4_ = 0;
  auVar255._0_8_ = uVar12;
  auVar255._12_2_ = uVar105;
  auVar255._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar12 >> 0x20);
  auVar254._12_4_ = auVar255._12_4_;
  auVar254._8_2_ = 0;
  auVar254._0_8_ = uVar12;
  auVar254._10_2_ = uVar105;
  auVar253._10_6_ = auVar254._10_6_;
  auVar253._8_2_ = uVar105;
  auVar253._0_8_ = uVar12;
  uVar105 = (undefined2)(uVar12 >> 0x10);
  auVar43._4_8_ = auVar253._8_8_;
  auVar43._2_2_ = uVar105;
  auVar43._0_2_ = uVar105;
  uVar13 = *(ulong *)(prim + uVar53 * 0x1d + 6);
  uVar105 = (undefined2)(uVar13 >> 0x30);
  auVar90._8_4_ = 0;
  auVar90._0_8_ = uVar13;
  auVar90._12_2_ = uVar105;
  auVar90._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar13 >> 0x20);
  auVar89._12_4_ = auVar90._12_4_;
  auVar89._8_2_ = 0;
  auVar89._0_8_ = uVar13;
  auVar89._10_2_ = uVar105;
  auVar88._10_6_ = auVar89._10_6_;
  auVar88._8_2_ = uVar105;
  auVar88._0_8_ = uVar13;
  uVar105 = (undefined2)(uVar13 >> 0x10);
  auVar44._4_8_ = auVar88._8_8_;
  auVar44._2_2_ = uVar105;
  auVar44._0_2_ = uVar105;
  fVar160 = (float)(auVar44._0_4_ >> 0x10);
  fVar211 = (float)(auVar88._8_4_ >> 0x10);
  uVar14 = *(ulong *)(prim + uVar53 + (ulong)(byte)PVar16 * 0x20 + 6);
  uVar105 = (undefined2)(uVar14 >> 0x30);
  auVar266._8_4_ = 0;
  auVar266._0_8_ = uVar14;
  auVar266._12_2_ = uVar105;
  auVar266._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar14 >> 0x20);
  auVar265._12_4_ = auVar266._12_4_;
  auVar265._8_2_ = 0;
  auVar265._0_8_ = uVar14;
  auVar265._10_2_ = uVar105;
  auVar264._10_6_ = auVar265._10_6_;
  auVar264._8_2_ = uVar105;
  auVar264._0_8_ = uVar14;
  uVar105 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar264._8_8_;
  auVar45._2_2_ = uVar105;
  auVar45._0_2_ = uVar105;
  uVar15 = *(ulong *)(prim + ((ulong)(byte)PVar16 * 0x20 - uVar53) + 6);
  uVar105 = (undefined2)(uVar15 >> 0x30);
  auVar93._8_4_ = 0;
  auVar93._0_8_ = uVar15;
  auVar93._12_2_ = uVar105;
  auVar93._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar15 >> 0x20);
  auVar92._12_4_ = auVar93._12_4_;
  auVar92._8_2_ = 0;
  auVar92._0_8_ = uVar15;
  auVar92._10_2_ = uVar105;
  auVar91._10_6_ = auVar92._10_6_;
  auVar91._8_2_ = uVar105;
  auVar91._0_8_ = uVar15;
  uVar105 = (undefined2)(uVar15 >> 0x10);
  auVar46._4_8_ = auVar91._8_8_;
  auVar46._2_2_ = uVar105;
  auVar46._0_2_ = uVar105;
  fVar162 = (float)(auVar46._0_4_ >> 0x10);
  fVar214 = (float)(auVar91._8_4_ >> 0x10);
  uVar53 = *(ulong *)(prim + uVar53 * 0x23 + 6);
  uVar105 = (undefined2)(uVar53 >> 0x30);
  auVar276._8_4_ = 0;
  auVar276._0_8_ = uVar53;
  auVar276._12_2_ = uVar105;
  auVar276._14_2_ = uVar105;
  uVar105 = (undefined2)(uVar53 >> 0x20);
  auVar275._12_4_ = auVar276._12_4_;
  auVar275._8_2_ = 0;
  auVar275._0_8_ = uVar53;
  auVar275._10_2_ = uVar105;
  auVar274._10_6_ = auVar275._10_6_;
  auVar274._8_2_ = uVar105;
  auVar274._0_8_ = uVar53;
  uVar105 = (undefined2)(uVar53 >> 0x10);
  auVar47._4_8_ = auVar274._8_8_;
  auVar47._2_2_ = uVar105;
  auVar47._0_2_ = uVar105;
  auVar155._0_8_ =
       CONCAT44(((((float)(auVar37._0_4_ >> 0x10) - fVar136) * fVar257 + fVar136) - fVar291) *
                fVar108,((((float)(int)(short)uVar63 - (float)(int)(short)uVar64) * fVar257 +
                         (float)(int)(short)uVar64) - fVar285) * fVar148);
  auVar155._8_4_ =
       ((((float)(auVar152._8_4_ >> 0x10) - fVar180) * fVar257 + fVar180) - fVar293) * fVar165;
  auVar155._12_4_ =
       ((((float)(auVar153._12_4_ >> 0x10) - (float)(auVar77._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar77._12_4_ >> 0x10)) - fVar295) * fVar219;
  auVar226._0_4_ =
       ((((float)(int)(short)uVar9 - (float)(int)(short)uVar8) * fVar257 + (float)(int)(short)uVar8)
       - fVar285) * fVar148;
  auVar226._4_4_ =
       ((((float)(auVar39._0_4_ >> 0x10) - fVar141) * fVar257 + fVar141) - fVar291) * fVar108;
  auVar226._8_4_ =
       ((((float)(auVar223._8_4_ >> 0x10) - fVar203) * fVar257 + fVar203) - fVar293) * fVar165;
  auVar226._12_4_ =
       ((((float)(auVar224._12_4_ >> 0x10) - (float)(auVar80._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar80._12_4_ >> 0x10)) - fVar295) * fVar219;
  auVar246._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar147) * fVar257 + fVar147) - fVar249) *
                fVar111,((((float)(int)(short)uVar11 - (float)(int)(short)uVar10) * fVar257 +
                         (float)(int)(short)uVar10) - fVar242) * fVar73);
  auVar246._8_4_ =
       ((((float)(auVar243._8_4_ >> 0x10) - fVar204) * fVar257 + fVar204) - fVar250) * fVar176;
  auVar246._12_4_ =
       ((((float)(auVar244._12_4_ >> 0x10) - (float)(auVar83._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar83._12_4_ >> 0x10)) - fVar284) * fVar228;
  auVar256._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar60) * fVar257 +
        (float)(int)(short)uVar60) - fVar242) * fVar73;
  auVar256._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar149) * fVar257 + fVar149) - fVar249) * fVar111;
  auVar256._8_4_ =
       ((((float)(auVar253._8_4_ >> 0x10) - fVar205) * fVar257 + fVar205) - fVar250) * fVar176;
  auVar256._12_4_ =
       ((((float)(auVar254._12_4_ >> 0x10) - (float)(auVar86._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar86._12_4_ >> 0x10)) - fVar284) * fVar228;
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar267._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar160) * fVar257 + fVar160) - fVar240) *
                fVar133,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar257 +
                         (float)(int)(short)uVar13) - fVar236) * fVar106);
  auVar267._8_4_ =
       ((((float)(auVar264._8_4_ >> 0x10) - fVar211) * fVar257 + fVar211) - fVar241) * fVar177;
  auVar267._12_4_ =
       ((((float)(auVar265._12_4_ >> 0x10) - (float)(auVar89._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar89._12_4_ >> 0x10)) - fVar251) * fVar231;
  auVar277._0_4_ =
       ((((float)(int)(short)uVar53 - (float)(int)(short)uVar15) * fVar257 +
        (float)(int)(short)uVar15) - fVar236) * fVar106;
  auVar277._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar162) * fVar257 + fVar162) - fVar240) * fVar133;
  auVar277._8_4_ =
       ((((float)(auVar274._8_4_ >> 0x10) - fVar214) * fVar257 + fVar214) - fVar241) * fVar177;
  auVar277._12_4_ =
       ((((float)(auVar275._12_4_ >> 0x10) - (float)(auVar92._12_4_ >> 0x10)) * fVar257 +
        (float)(auVar92._12_4_ >> 0x10)) - fVar251) * fVar231;
  auVar142._8_4_ = auVar155._8_4_;
  auVar142._0_8_ = auVar155._0_8_;
  auVar142._12_4_ = auVar155._12_4_;
  auVar143 = minps(auVar142,auVar226);
  auVar123._8_4_ = auVar246._8_4_;
  auVar123._0_8_ = auVar246._0_8_;
  auVar123._12_4_ = auVar246._12_4_;
  auVar75 = minps(auVar123,auVar256);
  auVar143 = maxps(auVar143,auVar75);
  auVar124._8_4_ = auVar267._8_4_;
  auVar124._0_8_ = auVar267._0_8_;
  auVar124._12_4_ = auVar267._12_4_;
  auVar75 = minps(auVar124,auVar277);
  auVar94._4_4_ = uVar57;
  auVar94._0_4_ = uVar57;
  auVar94._8_4_ = uVar57;
  auVar94._12_4_ = uVar57;
  auVar75 = maxps(auVar75,auVar94);
  auVar75 = maxps(auVar143,auVar75);
  auVar143 = maxps(auVar155,auVar226);
  auVar247 = maxps(auVar246,auVar256);
  auVar143 = minps(auVar143,auVar247);
  auVar247 = maxps(auVar267,auVar277);
  uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar95._4_4_ = uVar57;
  auVar95._0_4_ = uVar57;
  auVar95._8_4_ = uVar57;
  auVar95._12_4_ = uVar57;
  auVar247 = minps(auVar247,auVar95);
  local_48 = auVar75._0_4_ * 0.99999964;
  fStack_44 = auVar75._4_4_ * 0.99999964;
  fStack_40 = auVar75._8_4_ * 0.99999964;
  fStack_3c = auVar75._12_4_ * 0.99999964;
  auVar75 = minps(auVar143,auVar247);
  uVar66 = (uint)(byte)PVar16;
  auVar96._0_4_ = -(uint)(local_48 <= auVar75._0_4_ * 1.0000004 && uVar66 != 0);
  auVar96._4_4_ = -(uint)(fStack_44 <= auVar75._4_4_ * 1.0000004 && 1 < uVar66);
  auVar96._8_4_ = -(uint)(fStack_40 <= auVar75._8_4_ * 1.0000004 && 2 < uVar66);
  auVar96._12_4_ = -(uint)(fStack_3c <= auVar75._12_4_ * 1.0000004 && 3 < uVar66);
  uVar66 = movmskps(uVar66,auVar96);
  local_4f9 = uVar66 != 0;
  if (local_4f9) {
    uVar66 = uVar66 & 0xff;
    local_248 = pre->ray_space + k;
    local_3a8 = mm_lookupmask_ps._0_8_;
    uStack_3a0 = mm_lookupmask_ps._8_8_;
    local_308 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_300 = pre;
    local_240 = prim;
    do {
      lVar22 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar22 & 1) == 0; lVar22 = lVar22 + 1) {
        }
      }
      local_3b0 = (ulong)*(uint *)(local_240 + 2);
      local_2b8 = (ulong)*(uint *)(local_240 + lVar22 * 4 + 6);
      pGVar18 = (context->scene->geometries).items[local_3b0].ptr;
      uVar64 = (ulong)*(uint *)(*(long *)&pGVar18->field_0x58 +
                               local_2b8 *
                               pGVar18[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar148 = pGVar18->fnumTimeSegments;
      fVar73 = (pGVar18->time_range).lower;
      fVar106 = ((*(float *)(ray + k * 4 + 0x70) - fVar73) / ((pGVar18->time_range).upper - fVar73))
                * fVar148;
      fVar73 = floorf(fVar106);
      fVar148 = fVar148 + -1.0;
      if (fVar148 <= fVar73) {
        fVar73 = fVar148;
      }
      fVar148 = 0.0;
      if (0.0 <= fVar73) {
        fVar148 = fVar73;
      }
      _Var19 = pGVar18[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar54 = (long)(int)fVar148 * 0x38;
      lVar62 = *(long *)(_Var19 + 0x10 + lVar54);
      lVar20 = *(long *)(_Var19 + 0x38 + lVar54);
      lVar21 = *(long *)(_Var19 + 0x48 + lVar54);
      pfVar1 = (float *)(lVar20 + lVar21 * uVar64);
      lVar22 = uVar64 + 1;
      pfVar2 = (float *)(lVar20 + lVar21 * lVar22);
      p_Var55 = pGVar18[4].occlusionFilterN;
      pfVar3 = (float *)(*(long *)(_Var19 + lVar54) + lVar62 * uVar64);
      pfVar4 = (float *)(*(long *)(_Var19 + lVar54) + lVar62 * lVar22);
      pfVar5 = (float *)(*(long *)(p_Var55 + lVar54 + 0x38) +
                        uVar64 * *(long *)(p_Var55 + lVar54 + 0x48));
      fVar106 = fVar106 - fVar148;
      fVar111 = 1.0 - fVar106;
      pGVar61 = (Geometry *)(*(long *)(p_Var55 + lVar54 + 0x48) * lVar22);
      pfVar6 = (float *)((long)&(pGVar61->super_RefCount)._vptr_RefCount +
                        *(long *)(p_Var55 + lVar54 + 0x38));
      local_338 = *pfVar3 * fVar111 + *pfVar1 * fVar106;
      fStack_334 = pfVar3[1] * fVar111 + pfVar1[1] * fVar106;
      fStack_330 = pfVar3[2] * fVar111 + pfVar1[2] * fVar106;
      fStack_32c = pfVar3[3] * fVar111 + pfVar1[3] * fVar106;
      pfVar1 = (float *)(*(long *)(p_Var55 + lVar54) + *(long *)(p_Var55 + lVar54 + 0x10) * uVar64);
      fVar242 = *pfVar4 * fVar111 + *pfVar2 * fVar106;
      fVar249 = pfVar4[1] * fVar111 + pfVar2[1] * fVar106;
      fVar250 = pfVar4[2] * fVar111 + pfVar2[2] * fVar106;
      fStack_12c = pfVar4[3] * fVar111 + pfVar2[3] * fVar106;
      pfVar2 = (float *)(*(long *)(p_Var55 + lVar54) + *(long *)(p_Var55 + lVar54 + 0x10) * lVar22);
      iVar17 = (int)pGVar18[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar148 = *(float *)(ray + k * 4);
      fVar73 = *(float *)(ray + k * 4 + 0x10);
      fVar108 = *(float *)(ray + k * 4 + 0x20);
      fVar205 = (*pfVar1 * fVar111 + *pfVar5 * fVar106) * 0.33333334 + local_338;
      fVar211 = (pfVar1[1] * fVar111 + pfVar5[1] * fVar106) * 0.33333334 + fStack_334;
      fVar214 = (pfVar1[2] * fVar111 + pfVar5[2] * fVar106) * 0.33333334 + fStack_330;
      fStack_13c = (pfVar1[3] * fVar111 + pfVar5[3] * fVar106) * 0.33333334 + fStack_32c;
      fVar219 = fVar242 - (fVar111 * *pfVar2 + fVar106 * *pfVar6) * 0.33333334;
      fVar228 = fVar249 - (fVar111 * pfVar2[1] + fVar106 * pfVar6[1]) * 0.33333334;
      fVar231 = fVar250 - (fVar111 * pfVar2[2] + fVar106 * pfVar6[2]) * 0.33333334;
      local_258 = fStack_12c - (fVar111 * pfVar2[3] + fVar106 * pfVar6[3]) * 0.33333334;
      fVar165 = local_338 - fVar148;
      fVar176 = fStack_334 - fVar73;
      fVar177 = fStack_330 - fVar108;
      fVar106 = (local_248->vx).field_0.m128[0];
      fVar111 = (local_248->vx).field_0.m128[1];
      fVar133 = (local_248->vx).field_0.m128[2];
      fVar136 = (local_248->vy).field_0.m128[0];
      fVar141 = (local_248->vy).field_0.m128[1];
      fVar147 = (local_248->vy).field_0.m128[2];
      fVar149 = (local_248->vz).field_0.m128[0];
      fVar160 = (local_248->vz).field_0.m128[1];
      fVar162 = (local_248->vz).field_0.m128[2];
      local_128 = fVar165 * fVar106 + fVar176 * fVar136 + fVar177 * fVar149;
      local_298 = fVar165 * fVar111 + fVar176 * fVar141 + fVar177 * fVar160;
      fVar203 = fVar165 * fVar133 + fVar176 * fVar147 + fVar177 * fVar162;
      fVar165 = fVar205 - fVar148;
      fVar176 = fVar211 - fVar73;
      fVar177 = fVar214 - fVar108;
      fVar180 = fVar165 * fVar106 + fVar176 * fVar136 + fVar177 * fVar149;
      local_2a8 = fVar165 * fVar111 + fVar176 * fVar141 + fVar177 * fVar160;
      local_328 = fVar165 * fVar133 + fVar176 * fVar147 + fVar177 * fVar162;
      fVar165 = fVar219 - fVar148;
      fVar176 = fVar228 - fVar73;
      fVar177 = fVar231 - fVar108;
      fVar204 = fVar165 * fVar106 + fVar176 * fVar136 + fVar177 * fVar149;
      local_318 = fVar165 * fVar111 + fVar176 * fVar141 + fVar177 * fVar160;
      fVar165 = fVar165 * fVar133 + fVar176 * fVar147 + fVar177 * fVar162;
      fVar148 = fVar242 - fVar148;
      fVar73 = fVar249 - fVar73;
      fVar108 = fVar250 - fVar108;
      fVar106 = fVar148 * fVar106 + fVar73 * fVar136 + fVar108 * fVar149;
      local_288 = fVar148 * fVar111 + fVar73 * fVar141 + fVar108 * fVar160;
      local_278 = fVar148 * fVar133 + fVar73 * fVar147 + fVar108 * fVar162;
      auVar237._0_8_ = CONCAT44(local_298,local_128) & 0x7fffffff7fffffff;
      auVar237._8_4_ = ABS(fVar203);
      auVar237._12_4_ = ABS(fStack_32c);
      auVar166._0_8_ = CONCAT44(local_2a8,fVar180) & 0x7fffffff7fffffff;
      auVar166._8_4_ = ABS(local_328);
      auVar166._12_4_ = ABS(fStack_13c);
      auVar143 = maxps(auVar237,auVar166);
      auVar197._0_8_ = CONCAT44(local_318,fVar204) & 0x7fffffff7fffffff;
      auVar197._8_4_ = ABS(fVar165);
      auVar197._12_4_ = ABS(local_258);
      auVar125._0_8_ = CONCAT44(local_288,fVar106) & 0x7fffffff7fffffff;
      auVar125._8_4_ = ABS(local_278);
      auVar125._12_4_ = ABS(fStack_12c);
      auVar75 = maxps(auVar197,auVar125);
      auVar75 = maxps(auVar143,auVar75);
      fVar148 = auVar75._4_4_;
      if (auVar75._4_4_ <= auVar75._0_4_) {
        fVar148 = auVar75._0_4_;
      }
      auVar238._8_8_ = auVar75._8_8_;
      auVar238._0_8_ = auVar75._8_8_;
      fVar73 = (float)iVar17;
      local_2c8 = ZEXT416((uint)fVar73);
      if (auVar75._8_4_ <= fVar148) {
        auVar238._0_4_ = fVar148;
      }
      pRVar58 = (RTCIntersectArguments *)((long)iVar17 * 0x40);
      lVar22 = (long)iVar17 * 0x44;
      fVar108 = *(float *)(bezier_basis0 + lVar22 + 0x908);
      fVar111 = *(float *)(bezier_basis0 + lVar22 + 0x90c);
      fVar133 = *(float *)(bezier_basis0 + lVar22 + 0x910);
      fVar136 = *(float *)(bezier_basis0 + lVar22 + 0x914);
      fVar141 = *(float *)(bezier_basis0 + lVar22 + 0xd8c);
      fVar147 = *(float *)(bezier_basis0 + lVar22 + 0xd90);
      fVar149 = *(float *)(bezier_basis0 + lVar22 + 0xd94);
      fVar160 = *(float *)(bezier_basis0 + lVar22 + 0xd98);
      local_158 = fVar219;
      fStack_154 = fVar228;
      fStack_150 = fVar231;
      fStack_14c = local_258;
      local_138 = fVar242;
      fStack_134 = fVar249;
      fStack_130 = fVar250;
      fVar162 = *(float *)(bezier_basis0 + lVar22 + 0x484);
      fVar176 = *(float *)(bezier_basis0 + lVar22 + 0x488);
      fVar177 = *(float *)(bezier_basis0 + lVar22 + 0x48c);
      fVar284 = *(float *)(bezier_basis0 + lVar22 + 0x490);
      local_148 = fVar205;
      fStack_144 = fVar211;
      fStack_140 = fVar214;
      local_348 = *(float *)(bezier_basis0 + lVar22);
      fStack_344 = *(float *)(bezier_basis0 + lVar22 + 4);
      fStack_340 = *(float *)(bezier_basis0 + lVar22 + 8);
      fStack_33c = *(float *)(bezier_basis0 + lVar22 + 0xc);
      fVar150 = local_128 * local_348 + fVar180 * fVar162 + fVar204 * fVar108 + fVar106 * fVar141;
      fVar161 = local_128 * fStack_344 + fVar180 * fVar176 + fVar204 * fVar111 + fVar106 * fVar147;
      fVar163 = local_128 * fStack_340 + fVar180 * fVar177 + fVar204 * fVar133 + fVar106 * fVar149;
      fVar164 = local_128 * fStack_33c + fVar180 * fVar284 + fVar204 * fVar136 + fVar106 * fVar160;
      fVar291 = local_298 * local_348 +
                local_2a8 * fVar162 + local_318 * fVar108 + local_288 * fVar141;
      fVar293 = local_298 * fStack_344 +
                local_2a8 * fVar176 + local_318 * fVar111 + local_288 * fVar147;
      fVar295 = local_298 * fStack_340 +
                local_2a8 * fVar177 + local_318 * fVar133 + local_288 * fVar149;
      fVar305 = local_298 * fStack_33c +
                local_2a8 * fVar284 + local_318 * fVar136 + local_288 * fVar160;
      auVar198._0_4_ =
           fStack_32c * local_348 +
           fStack_13c * fVar162 + local_258 * fVar108 + fStack_12c * fVar141;
      auVar198._4_4_ =
           fStack_32c * fStack_344 +
           fStack_13c * fVar176 + local_258 * fVar111 + fStack_12c * fVar147;
      auVar198._8_4_ =
           fStack_32c * fStack_340 +
           fStack_13c * fVar177 + local_258 * fVar133 + fStack_12c * fVar149;
      auVar198._12_4_ =
           fStack_32c * fStack_33c +
           fStack_13c * fVar284 + local_258 * fVar136 + fStack_12c * fVar160;
      fVar236 = *(float *)(bezier_basis1 + lVar22 + 0xd8c);
      fVar240 = *(float *)(bezier_basis1 + lVar22 + 0xd90);
      fVar241 = *(float *)(bezier_basis1 + lVar22 + 0xd94);
      fVar251 = *(float *)(bezier_basis1 + lVar22 + 0xd98);
      fVar148 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar22 + 0x908);
      fVar257 = *(float *)(bezier_basis1 + lVar22 + 0x90c);
      fVar259 = *(float *)(bezier_basis1 + lVar22 + 0x910);
      auVar27 = *(undefined1 (*) [12])(bezier_basis1 + lVar22 + 0x908);
      fVar262 = *(float *)(bezier_basis1 + lVar22 + 0x914);
      local_58 = fStack_12c;
      fStack_54 = fStack_12c;
      fStack_50 = fStack_12c;
      fStack_4c = fStack_12c;
      fVar269 = *(float *)(bezier_basis1 + lVar22 + 0x484);
      fVar270 = *(float *)(bezier_basis1 + lVar22 + 0x488);
      fVar271 = *(float *)(bezier_basis1 + lVar22 + 0x48c);
      fVar272 = *(float *)(bezier_basis1 + lVar22 + 0x490);
      local_168 = fStack_13c;
      fStack_164 = fStack_13c;
      fStack_160 = fStack_13c;
      fStack_15c = fStack_13c;
      fVar281 = *(float *)(bezier_basis1 + lVar22);
      fVar282 = *(float *)(bezier_basis1 + lVar22 + 4);
      fVar283 = *(float *)(bezier_basis1 + lVar22 + 8);
      fVar285 = *(float *)(bezier_basis1 + lVar22 + 0xc);
      fStack_124 = local_128;
      fStack_120 = local_128;
      fStack_11c = local_128;
      fVar220 = local_128 * fVar281 + fVar180 * fVar269 + fVar204 * fVar148 + fVar106 * fVar236;
      fVar229 = local_128 * fVar282 + fVar180 * fVar270 + fVar204 * fVar257 + fVar106 * fVar240;
      fVar232 = local_128 * fVar283 + fVar180 * fVar271 + fVar204 * fVar259 + fVar106 * fVar241;
      fVar234 = local_128 * fVar285 + fVar180 * fVar272 + fVar204 * fVar262 + fVar106 * fVar251;
      fVar206 = local_298 * fVar281 +
                local_2a8 * fVar269 + local_318 * fVar148 + local_288 * fVar236;
      fVar212 = local_298 * fVar282 +
                local_2a8 * fVar270 + local_318 * fVar257 + local_288 * fVar240;
      fVar215 = local_298 * fVar283 +
                local_2a8 * fVar271 + local_318 * fVar259 + local_288 * fVar241;
      fVar217 = local_298 * fVar285 +
                local_2a8 * fVar272 + local_318 * fVar262 + local_288 * fVar251;
      local_178 = fStack_32c;
      fStack_174 = fStack_32c;
      fStack_170 = fStack_32c;
      fStack_16c = fStack_32c;
      auVar278._0_4_ =
           fStack_32c * fVar281 + fStack_13c * fVar269 + local_258 * fVar148 + fStack_12c * fVar236;
      auVar278._4_4_ =
           fStack_32c * fVar282 + fStack_13c * fVar270 + local_258 * fVar257 + fStack_12c * fVar240;
      auVar278._8_4_ =
           fStack_32c * fVar283 + fStack_13c * fVar271 + local_258 * fVar259 + fStack_12c * fVar241;
      auVar278._12_4_ =
           fStack_32c * fVar285 + fStack_13c * fVar272 + local_258 * fVar262 + fStack_12c * fVar251;
      fVar257 = fVar220 - fVar150;
      fVar259 = fVar229 - fVar161;
      fVar178 = fVar232 - fVar163;
      fVar179 = fVar234 - fVar164;
      fVar207 = fVar206 - fVar291;
      fVar213 = fVar212 - fVar293;
      fVar216 = fVar215 - fVar295;
      fVar218 = fVar217 - fVar305;
      fVar148 = fVar291 * fVar257 - fVar150 * fVar207;
      fVar301 = fVar293 * fVar259 - fVar161 * fVar213;
      fVar303 = fVar295 * fVar178 - fVar163 * fVar216;
      fVar306 = fVar305 * fVar179 - fVar164 * fVar218;
      auVar75 = maxps(auVar198,auVar278);
      bVar49 = fVar148 * fVar148 <=
               auVar75._0_4_ * auVar75._0_4_ * (fVar257 * fVar257 + fVar207 * fVar207) &&
               0.0 < fVar73;
      bVar50 = fVar301 * fVar301 <=
               auVar75._4_4_ * auVar75._4_4_ * (fVar259 * fVar259 + fVar213 * fVar213) &&
               1.0 < fVar73;
      bVar48 = fVar303 * fVar303 <=
               auVar75._8_4_ * auVar75._8_4_ * (fVar178 * fVar178 + fVar216 * fVar216) &&
               2.0 < fVar73;
      bVar65 = fVar306 * fVar306 <=
               auVar75._12_4_ * auVar75._12_4_ * (fVar179 * fVar179 + fVar218 * fVar218) &&
               3.0 < fVar73;
      local_388 = auVar238._0_4_;
      fStack_384 = auVar238._4_4_;
      fStack_380 = auVar238._8_4_;
      fStack_37c = auVar238._12_4_;
      local_388 = local_388 * 4.7683716e-07;
      auVar23._4_4_ = -(uint)bVar50;
      auVar23._0_4_ = -(uint)bVar49;
      auVar23._8_4_ = -(uint)bVar48;
      auVar23._12_4_ = -(uint)bVar65;
      iVar52 = movmskps(iVar17,auVar23);
      fVar148 = *(float *)(ray + k * 4 + 0x30);
      fStack_324 = local_328;
      fStack_320 = local_328;
      fStack_31c = local_328;
      fStack_314 = local_318;
      fStack_310 = local_318;
      fStack_30c = local_318;
      fStack_2a4 = local_2a8;
      fStack_2a0 = local_2a8;
      fStack_29c = local_2a8;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      fStack_284 = local_288;
      fStack_280 = local_288;
      fStack_27c = local_288;
      fStack_274 = local_278;
      fStack_270 = local_278;
      fStack_26c = local_278;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      if (iVar52 == 0) {
        bVar65 = false;
      }
      else {
        fStack_394 = 0.0;
        fStack_390 = 0.0;
        fStack_38c = 0.0;
        local_418 = auVar27._0_4_;
        fStack_414 = auVar27._4_4_;
        fStack_410 = auVar27._8_4_;
        fVar74 = fVar236 * local_278 + local_418 * fVar165 + fVar269 * local_328 + fVar281 * fVar203
        ;
        fVar107 = fVar240 * local_278 + fStack_414 * fVar165 + fVar270 * local_328 +
                  fVar282 * fVar203;
        fVar109 = fVar241 * local_278 + fStack_410 * fVar165 + fVar271 * local_328 +
                  fVar283 * fVar203;
        fVar110 = fVar251 * local_278 + fVar262 * fVar165 + fVar272 * local_328 + fVar285 * fVar203;
        fVar112 = fVar141 * local_278 + fVar108 * fVar165 + fVar162 * local_328 +
                  local_348 * fVar203;
        fVar134 = fVar147 * local_278 + fVar111 * fVar165 + fVar176 * local_328 +
                  fStack_344 * fVar203;
        fVar137 = fVar149 * local_278 + fVar133 * fVar165 + fVar177 * local_328 +
                  fStack_340 * fVar203;
        fVar139 = fVar160 * local_278 + fVar136 * fVar165 + fVar284 * local_328 +
                  fStack_33c * fVar203;
        fVar108 = *(float *)(bezier_basis0 + lVar22 + 0x1210);
        fVar111 = *(float *)(bezier_basis0 + lVar22 + 0x1214);
        fVar133 = *(float *)(bezier_basis0 + lVar22 + 0x1218);
        fVar136 = *(float *)(bezier_basis0 + lVar22 + 0x121c);
        fVar141 = *(float *)(bezier_basis0 + lVar22 + 0x1694);
        fVar147 = *(float *)(bezier_basis0 + lVar22 + 0x1698);
        fVar149 = *(float *)(bezier_basis0 + lVar22 + 0x169c);
        fVar160 = *(float *)(bezier_basis0 + lVar22 + 0x16a0);
        fVar162 = *(float *)(bezier_basis0 + lVar22 + 0x1b18);
        fVar176 = *(float *)(bezier_basis0 + lVar22 + 0x1b1c);
        fVar177 = *(float *)(bezier_basis0 + lVar22 + 0x1b20);
        fVar284 = *(float *)(bezier_basis0 + lVar22 + 0x1b24);
        fVar236 = *(float *)(bezier_basis0 + lVar22 + 0x1f9c);
        fVar240 = *(float *)(bezier_basis0 + lVar22 + 0x1fa0);
        fVar241 = *(float *)(bezier_basis0 + lVar22 + 0x1fa4);
        fVar251 = *(float *)(bezier_basis0 + lVar22 + 0x1fa8);
        fVar252 = local_128 * fVar108 + fVar180 * fVar141 + fVar204 * fVar162 + fVar106 * fVar236;
        fVar258 = local_128 * fVar111 + fVar180 * fVar147 + fVar204 * fVar176 + fVar106 * fVar240;
        fVar260 = local_128 * fVar133 + fVar180 * fVar149 + fVar204 * fVar177 + fVar106 * fVar241;
        fVar261 = local_128 * fVar136 + fVar180 * fVar160 + fVar204 * fVar284 + fVar106 * fVar251;
        fVar300 = local_298 * fVar108 +
                  local_2a8 * fVar141 + local_318 * fVar162 + local_288 * fVar236;
        fVar302 = local_298 * fVar111 +
                  local_2a8 * fVar147 + local_318 * fVar176 + local_288 * fVar240;
        fVar304 = local_298 * fVar133 +
                  local_2a8 * fVar149 + local_318 * fVar177 + local_288 * fVar241;
        fVar307 = local_298 * fVar136 +
                  local_2a8 * fVar160 + local_318 * fVar284 + local_288 * fVar251;
        fVar262 = *(float *)(bezier_basis1 + lVar22 + 0x1210);
        fVar269 = *(float *)(bezier_basis1 + lVar22 + 0x1214);
        fVar270 = *(float *)(bezier_basis1 + lVar22 + 0x1218);
        fVar271 = *(float *)(bezier_basis1 + lVar22 + 0x121c);
        fVar272 = *(float *)(bezier_basis1 + lVar22 + 0x1b18);
        fVar281 = *(float *)(bezier_basis1 + lVar22 + 0x1b1c);
        fVar282 = *(float *)(bezier_basis1 + lVar22 + 0x1b20);
        fVar283 = *(float *)(bezier_basis1 + lVar22 + 0x1b24);
        fVar285 = *(float *)(bezier_basis1 + lVar22 + 0x1f9c);
        fVar301 = *(float *)(bezier_basis1 + lVar22 + 0x1fa0);
        fVar303 = *(float *)(bezier_basis1 + lVar22 + 0x1fa4);
        fVar306 = *(float *)(bezier_basis1 + lVar22 + 0x1fa8);
        auVar167._0_4_ = local_288 * fVar285;
        auVar167._4_4_ = local_288 * fVar301;
        auVar167._8_4_ = local_288 * fVar303;
        auVar167._12_4_ = local_288 * fVar306;
        fVar286 = *(float *)(bezier_basis1 + lVar22 + 0x1694);
        fVar292 = *(float *)(bezier_basis1 + lVar22 + 0x1698);
        fVar294 = *(float *)(bezier_basis1 + lVar22 + 0x169c);
        fVar296 = *(float *)(bezier_basis1 + lVar22 + 0x16a0);
        fVar221 = local_128 * fVar262 + fVar180 * fVar286 + fVar204 * fVar272 + fVar106 * fVar285;
        fVar230 = local_128 * fVar269 + fVar180 * fVar292 + fVar204 * fVar281 + fVar106 * fVar301;
        fVar233 = local_128 * fVar270 + fVar180 * fVar294 + fVar204 * fVar282 + fVar106 * fVar303;
        fVar235 = local_128 * fVar271 + fVar180 * fVar296 + fVar204 * fVar283 + fVar106 * fVar306;
        fVar113 = local_298 * fVar262 + local_2a8 * fVar286 + local_318 * fVar272 + auVar167._0_4_;
        fVar135 = local_298 * fVar269 + local_2a8 * fVar292 + local_318 * fVar281 + auVar167._4_4_;
        fVar138 = local_298 * fVar270 + local_2a8 * fVar294 + local_318 * fVar282 + auVar167._8_4_;
        fVar140 = local_298 * fVar271 + local_2a8 * fVar296 + local_318 * fVar283 + auVar167._12_4_;
        auVar279._0_8_ = CONCAT44(fVar258,fVar252) & 0x7fffffff7fffffff;
        auVar279._8_4_ = ABS(fVar260);
        auVar279._12_4_ = ABS(fVar261);
        auVar239._0_8_ = CONCAT44(fVar302,fVar300) & 0x7fffffff7fffffff;
        auVar239._8_4_ = ABS(fVar304);
        auVar239._12_4_ = ABS(fVar307);
        auVar75 = maxps(auVar279,auVar239);
        auVar287._0_8_ =
             CONCAT44(fVar111 * fVar203 +
                      fVar147 * local_328 + fVar176 * fVar165 + fVar240 * local_278,
                      fVar108 * fVar203 +
                      fVar141 * local_328 + fVar162 * fVar165 + fVar236 * local_278) &
             0x7fffffff7fffffff;
        auVar287._8_4_ =
             ABS(fVar133 * fVar203 + fVar149 * local_328 + fVar177 * fVar165 + fVar241 * local_278);
        auVar287._12_4_ =
             ABS(fVar136 * fVar203 + fVar160 * local_328 + fVar284 * fVar165 + fVar251 * local_278);
        auVar75 = maxps(auVar75,auVar287);
        uVar67 = -(uint)(local_388 <= auVar75._0_4_);
        uVar68 = -(uint)(local_388 <= auVar75._4_4_);
        uVar69 = -(uint)(local_388 <= auVar75._8_4_);
        uVar70 = -(uint)(local_388 <= auVar75._12_4_);
        fVar147 = (float)((uint)fVar252 & uVar67 | ~uVar67 & (uint)fVar257);
        fVar160 = (float)((uint)fVar258 & uVar68 | ~uVar68 & (uint)fVar259);
        fVar236 = (float)((uint)fVar260 & uVar69 | ~uVar69 & (uint)fVar178);
        fVar240 = (float)((uint)fVar261 & uVar70 | ~uVar70 & (uint)fVar179);
        fVar241 = (float)(~uVar67 & (uint)fVar207 | (uint)fVar300 & uVar67);
        fVar251 = (float)(~uVar68 & (uint)fVar213 | (uint)fVar302 & uVar68);
        fVar252 = (float)(~uVar69 & (uint)fVar216 | (uint)fVar304 & uVar69);
        fVar258 = (float)(~uVar70 & (uint)fVar218 | (uint)fVar307 & uVar70);
        auVar288._0_8_ = CONCAT44(fVar230,fVar221) & 0x7fffffff7fffffff;
        auVar288._8_4_ = ABS(fVar233);
        auVar288._12_4_ = ABS(fVar235);
        auVar248._0_8_ = CONCAT44(fVar135,fVar113) & 0x7fffffff7fffffff;
        auVar248._8_4_ = ABS(fVar138);
        auVar248._12_4_ = ABS(fVar140);
        auVar75 = maxps(auVar288,auVar248);
        auVar209._0_8_ =
             CONCAT44(fVar269 * fVar203 +
                      fVar292 * local_328 + fVar281 * fVar165 + fVar301 * local_278,
                      fVar262 * fVar203 +
                      fVar286 * local_328 + fVar272 * fVar165 + fVar285 * local_278) &
             0x7fffffff7fffffff;
        auVar209._8_4_ =
             ABS(fVar270 * fVar203 + fVar294 * local_328 + fVar282 * fVar165 + fVar303 * local_278);
        auVar209._12_4_ =
             ABS(fVar271 * fVar203 + fVar296 * local_328 + fVar283 * fVar165 + fVar306 * local_278);
        auVar75 = maxps(auVar75,auVar209);
        uVar67 = -(uint)(local_388 <= auVar75._0_4_);
        uVar68 = -(uint)(local_388 <= auVar75._4_4_);
        uVar69 = -(uint)(local_388 <= auVar75._8_4_);
        uVar70 = -(uint)(local_388 <= auVar75._12_4_);
        fVar141 = (float)((uint)fVar221 & uVar67 | ~uVar67 & (uint)fVar257);
        fVar149 = (float)((uint)fVar230 & uVar68 | ~uVar68 & (uint)fVar259);
        fVar162 = (float)((uint)fVar233 & uVar69 | ~uVar69 & (uint)fVar178);
        fVar176 = (float)((uint)fVar235 & uVar70 | ~uVar70 & (uint)fVar179);
        fVar257 = (float)(~uVar67 & (uint)fVar207 | (uint)fVar113 & uVar67);
        fVar259 = (float)(~uVar68 & (uint)fVar213 | (uint)fVar135 & uVar68);
        fVar262 = (float)(~uVar69 & (uint)fVar216 | (uint)fVar138 & uVar69);
        fVar269 = (float)(~uVar70 & (uint)fVar218 | (uint)fVar140 & uVar70);
        auVar126._0_4_ = fVar241 * fVar241 + fVar147 * fVar147;
        auVar126._4_4_ = fVar251 * fVar251 + fVar160 * fVar160;
        auVar126._8_4_ = fVar252 * fVar252 + fVar236 * fVar236;
        auVar126._12_4_ = fVar258 * fVar258 + fVar240 * fVar240;
        auVar75 = rsqrtps(auVar167,auVar126);
        fVar108 = auVar75._0_4_;
        fVar111 = auVar75._4_4_;
        fVar133 = auVar75._8_4_;
        fVar136 = auVar75._12_4_;
        auVar168._0_4_ = fVar108 * fVar108 * auVar126._0_4_ * 0.5 * fVar108;
        auVar168._4_4_ = fVar111 * fVar111 * auVar126._4_4_ * 0.5 * fVar111;
        auVar168._8_4_ = fVar133 * fVar133 * auVar126._8_4_ * 0.5 * fVar133;
        auVar168._12_4_ = fVar136 * fVar136 * auVar126._12_4_ * 0.5 * fVar136;
        fVar270 = fVar108 * 1.5 - auVar168._0_4_;
        fVar271 = fVar111 * 1.5 - auVar168._4_4_;
        fVar272 = fVar133 * 1.5 - auVar168._8_4_;
        fVar281 = fVar136 * 1.5 - auVar168._12_4_;
        auVar127._0_4_ = fVar257 * fVar257 + fVar141 * fVar141;
        auVar127._4_4_ = fVar259 * fVar259 + fVar149 * fVar149;
        auVar127._8_4_ = fVar262 * fVar262 + fVar162 * fVar162;
        auVar127._12_4_ = fVar269 * fVar269 + fVar176 * fVar176;
        auVar75 = rsqrtps(auVar168,auVar127);
        fVar108 = auVar75._0_4_;
        fVar111 = auVar75._4_4_;
        fVar133 = auVar75._8_4_;
        fVar136 = auVar75._12_4_;
        fVar108 = fVar108 * 1.5 - fVar108 * fVar108 * auVar127._0_4_ * 0.5 * fVar108;
        fVar177 = fVar111 * 1.5 - fVar111 * fVar111 * auVar127._4_4_ * 0.5 * fVar111;
        fVar133 = fVar133 * 1.5 - fVar133 * fVar133 * auVar127._8_4_ * 0.5 * fVar133;
        fVar284 = fVar136 * 1.5 - fVar136 * fVar136 * auVar127._12_4_ * 0.5 * fVar136;
        fVar218 = fVar241 * fVar270 * auVar198._0_4_;
        fVar301 = fVar251 * fVar271 * auVar198._4_4_;
        fVar303 = fVar252 * fVar272 * auVar198._8_4_;
        fVar306 = fVar258 * fVar281 * auVar198._12_4_;
        fVar111 = -fVar147 * fVar270 * auVar198._0_4_;
        fVar136 = -fVar160 * fVar271 * auVar198._4_4_;
        fVar147 = -fVar236 * fVar272 * auVar198._8_4_;
        fVar160 = -fVar240 * fVar281 * auVar198._12_4_;
        local_348 = fVar291 + fVar111;
        fStack_344 = fVar293 + fVar136;
        fStack_340 = fVar295 + fVar147;
        fStack_33c = fVar305 + fVar160;
        fVar113 = fVar270 * 0.0 * auVar198._0_4_;
        fVar135 = fVar271 * 0.0 * auVar198._4_4_;
        fVar138 = fVar272 * 0.0 * auVar198._8_4_;
        fVar140 = fVar281 * 0.0 * auVar198._12_4_;
        fVar286 = fVar257 * fVar108 * auVar278._0_4_;
        fVar292 = fVar259 * fVar177 * auVar278._4_4_;
        fVar294 = fVar262 * fVar133 * auVar278._8_4_;
        fVar296 = fVar269 * fVar284 * auVar278._12_4_;
        fVar270 = fVar220 + fVar286;
        fVar271 = fVar229 + fVar292;
        fVar272 = fVar232 + fVar294;
        fVar281 = fVar234 + fVar296;
        fVar257 = -fVar141 * fVar108 * auVar278._0_4_;
        fVar259 = -fVar149 * fVar177 * auVar278._4_4_;
        fVar262 = -fVar162 * fVar133 * auVar278._8_4_;
        fVar269 = -fVar176 * fVar284 * auVar278._12_4_;
        fVar179 = fVar206 + fVar257;
        fVar207 = fVar212 + fVar259;
        fVar213 = fVar215 + fVar262;
        fVar216 = fVar217 + fVar269;
        fVar236 = fVar108 * 0.0 * auVar278._0_4_;
        fVar240 = fVar177 * 0.0 * auVar278._4_4_;
        fVar241 = fVar133 * 0.0 * auVar278._8_4_;
        fVar251 = fVar284 * 0.0 * auVar278._12_4_;
        fVar108 = fVar150 - fVar218;
        fVar133 = fVar161 - fVar301;
        fVar141 = fVar163 - fVar303;
        fVar149 = fVar164 - fVar306;
        fVar282 = fVar74 + fVar236;
        fVar283 = fVar107 + fVar240;
        fVar285 = fVar109 + fVar241;
        fVar178 = fVar110 + fVar251;
        fVar291 = fVar291 - fVar111;
        fVar293 = fVar293 - fVar136;
        fVar295 = fVar295 - fVar147;
        fVar305 = fVar305 - fVar160;
        fVar162 = fVar112 - fVar113;
        fVar176 = fVar134 - fVar135;
        fVar177 = fVar137 - fVar138;
        fVar284 = fVar139 - fVar140;
        uVar67 = -(uint)(0.0 < (fVar291 * (fVar282 - fVar162) - fVar162 * (fVar179 - fVar291)) * 0.0
                               + (fVar162 * (fVar270 - fVar108) - (fVar282 - fVar162) * fVar108) *
                                 0.0 + ((fVar179 - fVar291) * fVar108 -
                                       (fVar270 - fVar108) * fVar291));
        uVar68 = -(uint)(0.0 < (fVar293 * (fVar283 - fVar176) - fVar176 * (fVar207 - fVar293)) * 0.0
                               + (fVar176 * (fVar271 - fVar133) - (fVar283 - fVar176) * fVar133) *
                                 0.0 + ((fVar207 - fVar293) * fVar133 -
                                       (fVar271 - fVar133) * fVar293));
        uVar69 = -(uint)(0.0 < (fVar295 * (fVar285 - fVar177) - fVar177 * (fVar213 - fVar295)) * 0.0
                               + (fVar177 * (fVar272 - fVar141) - (fVar285 - fVar177) * fVar141) *
                                 0.0 + ((fVar213 - fVar295) * fVar141 -
                                       (fVar272 - fVar141) * fVar295));
        uVar70 = -(uint)(0.0 < (fVar305 * (fVar178 - fVar284) - fVar284 * (fVar216 - fVar305)) * 0.0
                               + (fVar284 * (fVar281 - fVar149) - (fVar178 - fVar284) * fVar149) *
                                 0.0 + ((fVar216 - fVar305) * fVar149 -
                                       (fVar281 - fVar149) * fVar305));
        fVar218 = (float)((uint)(fVar220 - fVar286) & uVar67 | ~uVar67 & (uint)(fVar150 + fVar218));
        fVar220 = (float)((uint)(fVar229 - fVar292) & uVar68 | ~uVar68 & (uint)(fVar161 + fVar301));
        fVar229 = (float)((uint)(fVar232 - fVar294) & uVar69 | ~uVar69 & (uint)(fVar163 + fVar303));
        fVar232 = (float)((uint)(fVar234 - fVar296) & uVar70 | ~uVar70 & (uint)(fVar164 + fVar306));
        fVar257 = (float)((uint)(fVar206 - fVar257) & uVar67 | ~uVar67 & (uint)local_348);
        fVar259 = (float)((uint)(fVar212 - fVar259) & uVar68 | ~uVar68 & (uint)fStack_344);
        fVar262 = (float)((uint)(fVar215 - fVar262) & uVar69 | ~uVar69 & (uint)fStack_340);
        fVar269 = (float)((uint)(fVar217 - fVar269) & uVar70 | ~uVar70 & (uint)fStack_33c);
        fVar150 = (float)((uint)(fVar74 - fVar236) & uVar67 | ~uVar67 & (uint)(fVar112 + fVar113));
        fVar161 = (float)((uint)(fVar107 - fVar240) & uVar68 | ~uVar68 & (uint)(fVar134 + fVar135));
        fVar163 = (float)((uint)(fVar109 - fVar241) & uVar69 | ~uVar69 & (uint)(fVar137 + fVar138));
        fVar164 = (float)((uint)(fVar110 - fVar251) & uVar70 | ~uVar70 & (uint)(fVar139 + fVar140));
        fVar111 = (float)((uint)fVar108 & uVar67 | ~uVar67 & (uint)fVar270);
        fVar136 = (float)((uint)fVar133 & uVar68 | ~uVar68 & (uint)fVar271);
        fVar147 = (float)((uint)fVar141 & uVar69 | ~uVar69 & (uint)fVar272);
        fVar160 = (float)((uint)fVar149 & uVar70 | ~uVar70 & (uint)fVar281);
        fVar236 = (float)((uint)fVar291 & uVar67 | ~uVar67 & (uint)fVar179);
        fVar240 = (float)((uint)fVar293 & uVar68 | ~uVar68 & (uint)fVar207);
        fVar241 = (float)((uint)fVar295 & uVar69 | ~uVar69 & (uint)fVar213);
        fVar251 = (float)((uint)fVar305 & uVar70 | ~uVar70 & (uint)fVar216);
        fVar206 = (float)((uint)fVar162 & uVar67 | ~uVar67 & (uint)fVar282);
        fVar212 = (float)((uint)fVar176 & uVar68 | ~uVar68 & (uint)fVar283);
        fVar215 = (float)((uint)fVar177 & uVar69 | ~uVar69 & (uint)fVar285);
        fVar217 = (float)((uint)fVar284 & uVar70 | ~uVar70 & (uint)fVar178);
        fVar270 = (float)((uint)fVar270 & uVar67 | ~uVar67 & (uint)fVar108) - fVar218;
        fVar271 = (float)((uint)fVar271 & uVar68 | ~uVar68 & (uint)fVar133) - fVar220;
        fVar272 = (float)((uint)fVar272 & uVar69 | ~uVar69 & (uint)fVar141) - fVar229;
        fVar281 = (float)((uint)fVar281 & uVar70 | ~uVar70 & (uint)fVar149) - fVar232;
        fVar179 = (float)((uint)fVar179 & uVar67 | ~uVar67 & (uint)fVar291) - fVar257;
        fVar293 = (float)((uint)fVar207 & uVar68 | ~uVar68 & (uint)fVar293) - fVar259;
        fVar295 = (float)((uint)fVar213 & uVar69 | ~uVar69 & (uint)fVar295) - fVar262;
        fVar305 = (float)((uint)fVar216 & uVar70 | ~uVar70 & (uint)fVar305) - fVar269;
        fVar282 = (float)((uint)fVar282 & uVar67 | ~uVar67 & (uint)fVar162) - fVar150;
        fVar283 = (float)((uint)fVar283 & uVar68 | ~uVar68 & (uint)fVar176) - fVar161;
        fVar285 = (float)((uint)fVar285 & uVar69 | ~uVar69 & (uint)fVar177) - fVar163;
        fVar291 = (float)((uint)fVar178 & uVar70 | ~uVar70 & (uint)fVar284) - fVar164;
        fVar234 = fVar218 - fVar111;
        fVar301 = fVar220 - fVar136;
        fVar303 = fVar229 - fVar147;
        fVar306 = fVar232 - fVar160;
        fVar162 = fVar257 - fVar236;
        fVar176 = fVar259 - fVar240;
        fVar177 = fVar262 - fVar241;
        fVar284 = fVar269 - fVar251;
        fVar108 = fVar150 - fVar206;
        fVar133 = fVar161 - fVar212;
        fVar141 = fVar163 - fVar215;
        fVar149 = fVar164 - fVar217;
        fVar178 = (fVar257 * fVar282 - fVar150 * fVar179) * 0.0 +
                  (fVar150 * fVar270 - fVar218 * fVar282) * 0.0 +
                  (fVar218 * fVar179 - fVar257 * fVar270);
        fVar207 = (fVar259 * fVar283 - fVar161 * fVar293) * 0.0 +
                  (fVar161 * fVar271 - fVar220 * fVar283) * 0.0 +
                  (fVar220 * fVar293 - fVar259 * fVar271);
        auVar156._4_4_ = fVar207;
        auVar156._0_4_ = fVar178;
        fVar213 = (fVar262 * fVar285 - fVar163 * fVar295) * 0.0 +
                  (fVar163 * fVar272 - fVar229 * fVar285) * 0.0 +
                  (fVar229 * fVar295 - fVar262 * fVar272);
        fVar216 = (fVar269 * fVar291 - fVar164 * fVar305) * 0.0 +
                  (fVar164 * fVar281 - fVar232 * fVar291) * 0.0 +
                  (fVar232 * fVar305 - fVar269 * fVar281);
        auVar297._0_4_ =
             (fVar236 * fVar108 - fVar206 * fVar162) * 0.0 +
             (fVar206 * fVar234 - fVar111 * fVar108) * 0.0 + (fVar111 * fVar162 - fVar236 * fVar234)
        ;
        auVar297._4_4_ =
             (fVar240 * fVar133 - fVar212 * fVar176) * 0.0 +
             (fVar212 * fVar301 - fVar136 * fVar133) * 0.0 + (fVar136 * fVar176 - fVar240 * fVar301)
        ;
        auVar297._8_4_ =
             (fVar241 * fVar141 - fVar215 * fVar177) * 0.0 +
             (fVar215 * fVar303 - fVar147 * fVar141) * 0.0 + (fVar147 * fVar177 - fVar241 * fVar303)
        ;
        auVar297._12_4_ =
             (fVar251 * fVar149 - fVar217 * fVar284) * 0.0 +
             (fVar217 * fVar306 - fVar160 * fVar149) * 0.0 + (fVar160 * fVar284 - fVar251 * fVar306)
        ;
        auVar156._8_4_ = fVar213;
        auVar156._12_4_ = fVar216;
        auVar75 = maxps(auVar156,auVar297);
        bVar49 = auVar75._0_4_ <= 0.0 && bVar49;
        auVar157._0_4_ = -(uint)bVar49;
        bVar50 = auVar75._4_4_ <= 0.0 && bVar50;
        auVar157._4_4_ = -(uint)bVar50;
        bVar48 = auVar75._8_4_ <= 0.0 && bVar48;
        auVar157._8_4_ = -(uint)bVar48;
        bVar65 = auVar75._12_4_ <= 0.0 && bVar65;
        auVar157._12_4_ = -(uint)bVar65;
        iVar52 = movmskps(iVar52,auVar157);
        if (iVar52 == 0) {
          auVar97._8_8_ = uStack_3a0;
          auVar97._0_8_ = local_3a8;
          iVar52 = 0;
        }
        else {
          auVar169._0_4_ = fVar108 * fVar179;
          auVar169._4_4_ = fVar133 * fVar293;
          auVar169._8_4_ = fVar141 * fVar295;
          auVar169._12_4_ = fVar149 * fVar305;
          fVar236 = fVar162 * fVar282 - auVar169._0_4_;
          fVar240 = fVar176 * fVar283 - auVar169._4_4_;
          fVar241 = fVar177 * fVar285 - auVar169._8_4_;
          fVar251 = fVar284 * fVar291 - auVar169._12_4_;
          fVar108 = fVar108 * fVar270 - fVar282 * fVar234;
          fVar133 = fVar133 * fVar271 - fVar283 * fVar301;
          fVar141 = fVar141 * fVar272 - fVar285 * fVar303;
          fVar149 = fVar149 * fVar281 - fVar291 * fVar306;
          fVar162 = fVar234 * fVar179 - fVar162 * fVar270;
          fVar176 = fVar301 * fVar293 - fVar176 * fVar271;
          fVar177 = fVar303 * fVar295 - fVar177 * fVar272;
          fVar284 = fVar306 * fVar305 - fVar284 * fVar281;
          auVar199._0_4_ = fVar236 * 0.0 + fVar108 * 0.0 + fVar162;
          auVar199._4_4_ = fVar240 * 0.0 + fVar133 * 0.0 + fVar176;
          auVar199._8_4_ = fVar241 * 0.0 + fVar141 * 0.0 + fVar177;
          auVar199._12_4_ = fVar251 * 0.0 + fVar149 * 0.0 + fVar284;
          auVar75 = rcpps(auVar169,auVar199);
          fVar111 = auVar75._0_4_;
          fVar136 = auVar75._4_4_;
          fVar147 = auVar75._8_4_;
          fVar160 = auVar75._12_4_;
          fVar111 = (1.0 - auVar199._0_4_ * fVar111) * fVar111 + fVar111;
          fVar136 = (1.0 - auVar199._4_4_ * fVar136) * fVar136 + fVar136;
          fVar147 = (1.0 - auVar199._8_4_ * fVar147) * fVar147 + fVar147;
          fVar160 = (1.0 - auVar199._12_4_ * fVar160) * fVar160 + fVar160;
          fVar162 = (fVar150 * fVar162 + fVar257 * fVar108 + fVar218 * fVar236) * fVar111;
          fVar133 = (fVar161 * fVar176 + fVar259 * fVar133 + fVar220 * fVar240) * fVar136;
          fVar141 = (fVar163 * fVar177 + fVar262 * fVar141 + fVar229 * fVar241) * fVar147;
          fVar149 = (fVar164 * fVar284 + fVar269 * fVar149 + fVar232 * fVar251) * fVar160;
          fVar108 = *(float *)(ray + k * 4 + 0x80);
          bVar49 = (fVar162 <= fVar108 && fVar148 <= fVar162) && bVar49;
          auVar170._0_4_ = -(uint)bVar49;
          bVar50 = (fVar133 <= fVar108 && fVar148 <= fVar133) && bVar50;
          auVar170._4_4_ = -(uint)bVar50;
          bVar48 = (fVar141 <= fVar108 && fVar148 <= fVar141) && bVar48;
          auVar170._8_4_ = -(uint)bVar48;
          bVar65 = (fVar149 <= fVar108 && fVar148 <= fVar149) && bVar65;
          auVar170._12_4_ = -(uint)bVar65;
          iVar52 = movmskps(iVar52,auVar170);
          if (iVar52 == 0) {
            auVar97._8_8_ = uStack_3a0;
            auVar97._0_8_ = local_3a8;
            iVar52 = 0;
          }
          else {
            auVar171._0_8_ =
                 CONCAT44(-(uint)(auVar199._4_4_ != 0.0 && bVar50),
                          -(uint)(auVar199._0_4_ != 0.0 && bVar49));
            auVar171._8_4_ = -(uint)(auVar199._8_4_ != 0.0 && bVar48);
            auVar171._12_4_ = -(uint)(auVar199._12_4_ != 0.0 && bVar65);
            iVar52 = movmskps(iVar52,auVar171);
            auVar97._8_8_ = uStack_3a0;
            auVar97._0_8_ = local_3a8;
            if (iVar52 != 0) {
              fVar178 = fVar178 * fVar111;
              fVar207 = fVar207 * fVar136;
              fVar213 = fVar213 * fVar147;
              fVar216 = fVar216 * fVar160;
              local_3e8 = (float)((uint)(1.0 - fVar178) & uVar67 | ~uVar67 & (uint)fVar178);
              fStack_3e4 = (float)((uint)(1.0 - fVar207) & uVar68 | ~uVar68 & (uint)fVar207);
              fStack_3e0 = (float)((uint)(1.0 - fVar213) & uVar69 | ~uVar69 & (uint)fVar213);
              fStack_3dc = (float)((uint)(1.0 - fVar216) & uVar70 | ~uVar70 & (uint)fVar216);
              local_268 = (float)(~uVar67 & (uint)(auVar297._0_4_ * fVar111) |
                                 (uint)(1.0 - auVar297._0_4_ * fVar111) & uVar67);
              fStack_264 = (float)(~uVar68 & (uint)(auVar297._4_4_ * fVar136) |
                                  (uint)(1.0 - auVar297._4_4_ * fVar136) & uVar68);
              fStack_260 = (float)(~uVar69 & (uint)(auVar297._8_4_ * fVar147) |
                                  (uint)(1.0 - auVar297._8_4_ * fVar147) & uVar69);
              fStack_25c = (float)(~uVar70 & (uint)(auVar297._12_4_ * fVar160) |
                                  (uint)(1.0 - auVar297._12_4_ * fVar160) & uVar70);
              auVar97._8_4_ = auVar171._8_4_;
              auVar97._0_8_ = auVar171._0_8_;
              auVar97._12_4_ = auVar171._12_4_;
              local_3f8 = fVar162;
              fStack_3f4 = fVar133;
              fStack_3f0 = fVar141;
              fStack_3ec = fVar149;
            }
          }
        }
        iVar52 = movmskps(iVar52,auVar97);
        local_398 = fVar148;
        if (iVar52 == 0) {
          bVar65 = false;
        }
        else {
          fVar111 = (auVar278._0_4_ - auVar198._0_4_) * local_3e8 + auVar198._0_4_;
          fVar133 = (auVar278._4_4_ - auVar198._4_4_) * fStack_3e4 + auVar198._4_4_;
          fVar136 = (auVar278._8_4_ - auVar198._8_4_) * fStack_3e0 + auVar198._8_4_;
          fVar141 = (auVar278._12_4_ - auVar198._12_4_) * fStack_3dc + auVar198._12_4_;
          fVar108 = *(float *)((long)local_300->ray_space + k * 4 + -0x10);
          auVar128._0_4_ = -(uint)(fVar108 * (fVar111 + fVar111) < local_3f8) & auVar97._0_4_;
          auVar128._4_4_ = -(uint)(fVar108 * (fVar133 + fVar133) < fStack_3f4) & auVar97._4_4_;
          auVar128._8_4_ = -(uint)(fVar108 * (fVar136 + fVar136) < fStack_3f0) & auVar97._8_4_;
          auVar128._12_4_ = -(uint)(fVar108 * (fVar141 + fVar141) < fStack_3ec) & auVar97._12_4_;
          uVar67 = movmskps((int)local_300,auVar128);
          if (uVar67 != 0) {
            local_268 = local_268 + local_268 + -1.0;
            fStack_264 = fStack_264 + fStack_264 + -1.0;
            fStack_260 = fStack_260 + fStack_260 + -1.0;
            fStack_25c = fStack_25c + fStack_25c + -1.0;
            local_208 = 0;
            local_1f8 = CONCAT44(fStack_334,local_338);
            uStack_1f0 = CONCAT44(fStack_32c,fStack_330);
            local_1e8 = CONCAT44(fVar211,fVar205);
            uStack_1e0 = CONCAT44(fStack_13c,fVar214);
            local_1d8 = CONCAT44(fVar228,fVar219);
            uStack_1d0 = CONCAT44(local_258,fVar231);
            local_1c8 = CONCAT44(fVar249,fVar242);
            uStack_1c0 = CONCAT44(fStack_12c,fVar250);
            pRVar58 = (RTCIntersectArguments *)(ulong)*(uint *)(ray + k * 4 + 0x90);
            local_238 = local_3e8;
            fStack_234 = fStack_3e4;
            fStack_230 = fStack_3e0;
            fStack_22c = fStack_3dc;
            local_228 = local_268;
            fStack_224 = fStack_264;
            fStack_220 = fStack_260;
            fStack_21c = fStack_25c;
            local_218 = local_3f8;
            fStack_214 = fStack_3f4;
            fStack_210 = fStack_3f0;
            fStack_20c = fStack_3ec;
            local_204 = iVar17;
            local_1b8 = auVar128;
            if ((pGVar18->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              pRVar58 = context->args;
              if ((pRVar58->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar65 = true, pGVar18->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar73 = 1.0 / fVar73;
                local_1a8[0] = fVar73 * (local_3e8 + 0.0);
                local_1a8[1] = fVar73 * (fStack_3e4 + 1.0);
                local_1a8[2] = fVar73 * (fStack_3e0 + 2.0);
                local_1a8[3] = fVar73 * (fStack_3dc + 3.0);
                local_198 = CONCAT44(fStack_264,local_268);
                uStack_190 = CONCAT44(fStack_25c,fStack_260);
                local_188[0] = local_3f8;
                local_188[1] = fStack_3f4;
                local_188[2] = fStack_3f0;
                local_188[3] = fStack_3ec;
                pGVar61 = (Geometry *)(ulong)(uVar67 & 0xff);
                uVar64 = 0;
                if (pGVar61 != (Geometry *)0x0) {
                  for (; ((uVar67 & 0xff) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                  }
                }
                local_438 = CONCAT44((undefined4)local_3b0,(undefined4)local_3b0);
                uStack_430._0_4_ = (undefined4)local_3b0;
                uStack_430._4_4_ = (undefined4)local_3b0;
                local_458 = CONCAT44((undefined4)local_2b8,(undefined4)local_2b8);
                uStack_450._0_4_ = (undefined4)local_2b8;
                uStack_450._4_4_ = (undefined4)local_2b8;
                uVar24 = *local_308;
                uVar25 = local_308[1];
                bVar65 = true;
                do {
                  local_e8 = local_1a8[uVar64];
                  uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_d8 = *(undefined4 *)((long)&local_198 + uVar64 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_188[uVar64];
                  fVar73 = 1.0 - local_e8;
                  fVar111 = local_e8 * fVar73 + local_e8 * fVar73;
                  fVar133 = (fVar111 - local_e8 * local_e8) * 3.0;
                  fVar108 = local_e8 * local_e8 * 3.0;
                  fVar111 = (fVar73 * fVar73 - fVar111) * 3.0;
                  local_2f8.context = context->user;
                  fVar73 = fVar73 * fVar73 * -3.0;
                  local_118 = fVar73 * local_338 +
                              fVar111 * fVar205 + fVar133 * fVar219 + fVar108 * fVar242;
                  local_108 = fVar73 * fStack_334 +
                              fVar111 * fVar211 + fVar133 * fVar228 + fVar108 * fVar249;
                  local_f8 = fVar73 * fStack_330 +
                             fVar111 * fVar214 + fVar133 * fVar231 + fVar108 * fVar250;
                  fStack_114 = local_118;
                  fStack_110 = local_118;
                  fStack_10c = local_118;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_458;
                  uStack_c0 = uStack_450;
                  local_b8 = local_438;
                  uStack_b0 = uStack_430;
                  local_a8 = (local_2f8.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_2f8.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_2f8.valid = (int *)&local_3c8;
                  pRVar58 = (RTCIntersectArguments *)pGVar18->userPtr;
                  local_2f8.hit = (RTCHitN *)&local_118;
                  local_2f8.N = 4;
                  p_Var55 = pGVar18->occlusionFilterN;
                  local_3c8 = uVar24;
                  uStack_3c0 = uVar25;
                  local_2f8.geometryUserPtr = pRVar58;
                  local_2f8.ray = (RTCRayN *)ray;
                  if (p_Var55 != (RTCFilterFunctionN)0x0) {
                    p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_2f8);
                    fVar148 = local_398;
                  }
                  auVar98._0_4_ = -(uint)((int)local_3c8 == 0);
                  auVar98._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                  auVar98._8_4_ = -(uint)((int)uStack_3c0 == 0);
                  auVar98._12_4_ = -(uint)(uStack_3c0._4_4_ == 0);
                  uVar67 = movmskps((int)p_Var55,auVar98);
                  pRVar56 = (RTCRayN *)(ulong)(uVar67 ^ 0xf);
                  if ((uVar67 ^ 0xf) == 0) {
                    auVar98 = auVar98 ^ _DAT_01febe20;
                  }
                  else {
                    pRVar58 = context->args;
                    if ((pRVar58->filter != (RTCFilterFunctionN)0x0) &&
                       (((pRVar58->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar18->field_8).field_0x2 & 0x40) != 0)))) {
                      (*pRVar58->filter)(&local_2f8);
                      fVar148 = local_398;
                    }
                    auVar129._0_4_ = -(uint)((int)local_3c8 == 0);
                    auVar129._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                    auVar129._8_4_ = -(uint)((int)uStack_3c0 == 0);
                    auVar129._12_4_ = -(uint)(uStack_3c0._4_4_ == 0);
                    auVar98 = auVar129 ^ _DAT_01febe20;
                    *(undefined1 (*) [16])(local_2f8.ray + 0x80) =
                         ~auVar129 & _DAT_01feba00 |
                         *(undefined1 (*) [16])(local_2f8.ray + 0x80) & auVar129;
                    pRVar56 = local_2f8.ray;
                  }
                  auVar99._0_4_ = auVar98._0_4_ << 0x1f;
                  auVar99._4_4_ = auVar98._4_4_ << 0x1f;
                  auVar99._8_4_ = auVar98._8_4_ << 0x1f;
                  auVar99._12_4_ = auVar98._12_4_ << 0x1f;
                  iVar52 = movmskps((int)pRVar56,auVar99);
                  if (iVar52 != 0) break;
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar57;
                  pGVar61 = (Geometry *)((ulong)pGVar61 ^ 1L << (uVar64 & 0x3f));
                  uVar64 = 0;
                  if (pGVar61 != (Geometry *)0x0) {
                    for (; ((ulong)pGVar61 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                    }
                  }
                  bVar65 = pGVar61 != (Geometry *)0x0;
                } while (bVar65);
              }
              goto LAB_00c0ea67;
            }
          }
          bVar65 = false;
        }
      }
LAB_00c0ea67:
      uVar57 = SUB84(pRVar58,0);
      if (4 < iVar17) {
        local_68 = iVar17;
        iStack_64 = iVar17;
        iStack_60 = iVar17;
        iStack_5c = iVar17;
        local_88 = 1.0 / (float)local_2c8._0_4_;
        fStack_84 = local_88;
        fStack_80 = local_88;
        fStack_7c = local_88;
        local_2c8._4_4_ = (undefined4)local_3b0;
        local_2c8._0_4_ = (undefined4)local_3b0;
        local_2c8._8_4_ = (undefined4)local_3b0;
        local_2c8._12_4_ = (undefined4)local_3b0;
        local_78 = (undefined4)local_2b8;
        uStack_74 = (undefined4)local_2b8;
        uStack_70 = (undefined4)local_2b8;
        uStack_6c = (undefined4)local_2b8;
        lVar62 = 4;
        fStack_384 = local_388;
        fStack_380 = local_388;
        fStack_37c = local_388;
        local_398 = fVar148;
        fStack_394 = fVar148;
        fStack_390 = fVar148;
        fStack_38c = fVar148;
        do {
          fVar283 = fStack_130;
          fVar282 = fStack_134;
          fVar281 = local_138;
          fVar272 = fStack_140;
          fVar271 = fStack_144;
          fVar270 = local_148;
          fVar269 = fStack_150;
          fVar262 = fStack_154;
          fVar259 = local_158;
          uVar68 = (uint)lVar62;
          puVar59 = bezier_basis0 + lVar22;
          pfVar1 = (float *)(puVar59 + lVar62 * 4);
          fVar148 = *pfVar1;
          fVar73 = pfVar1[1];
          fVar108 = pfVar1[2];
          fVar111 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2227768 + lVar62 * 4);
          fVar133 = *pfVar1;
          fVar136 = pfVar1[1];
          fVar141 = pfVar1[2];
          fVar147 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2227bec + lVar62 * 4);
          local_348 = *pfVar1;
          fStack_344 = pfVar1[1];
          fStack_340 = pfVar1[2];
          fStack_33c = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2228070 + lVar62 * 4);
          fVar149 = *pfVar1;
          fVar160 = pfVar1[1];
          fVar162 = pfVar1[2];
          fVar176 = pfVar1[3];
          fVar216 = local_128 * fVar148 +
                    fVar180 * fVar133 + fVar204 * local_348 + fVar106 * fVar149;
          fVar217 = fStack_124 * fVar73 +
                    fVar180 * fVar136 + fVar204 * fStack_344 + fVar106 * fVar160;
          fVar218 = fStack_120 * fVar108 +
                    fVar180 * fVar141 + fVar204 * fStack_340 + fVar106 * fVar162;
          fVar220 = fStack_11c * fVar111 +
                    fVar180 * fVar147 + fVar204 * fStack_33c + fVar106 * fVar176;
          fVar229 = local_298 * fVar148 +
                    local_2a8 * fVar133 + local_318 * local_348 + local_288 * fVar149;
          fVar234 = fStack_294 * fVar73 +
                    fStack_2a4 * fVar136 + fStack_314 * fStack_344 + fStack_284 * fVar160;
          fVar303 = fStack_290 * fVar108 +
                    fStack_2a0 * fVar141 + fStack_310 * fStack_340 + fStack_280 * fVar162;
          fVar286 = fStack_28c * fVar111 +
                    fStack_29c * fVar147 + fStack_30c * fStack_33c + fStack_27c * fVar176;
          auVar131._0_4_ =
               local_178 * fVar148 +
               local_168 * fVar133 + local_258 * local_348 + local_58 * fVar149;
          auVar131._4_4_ =
               fStack_174 * fVar73 +
               fStack_164 * fVar136 + fStack_254 * fStack_344 + fStack_54 * fVar160;
          auVar131._8_4_ =
               fStack_170 * fVar108 +
               fStack_160 * fVar141 + fStack_250 * fStack_340 + fStack_50 * fVar162;
          auVar131._12_4_ =
               fStack_16c * fVar111 +
               fStack_15c * fVar147 + fStack_24c * fStack_33c + fStack_4c * fVar176;
          pfVar1 = (float *)(bezier_basis1 + lVar22 + lVar62 * 4);
          fVar177 = *pfVar1;
          fVar205 = pfVar1[1];
          fVar211 = pfVar1[2];
          fVar214 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x2229b88 + lVar62 * 4);
          fVar219 = *pfVar1;
          fVar228 = pfVar1[1];
          fVar231 = pfVar1[2];
          fVar242 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x222a00c + lVar62 * 4);
          fVar249 = *pfVar1;
          fVar250 = pfVar1[1];
          fVar284 = pfVar1[2];
          fVar236 = pfVar1[3];
          pfVar1 = (float *)(lVar22 + 0x222a490 + lVar62 * 4);
          fVar240 = *pfVar1;
          fVar241 = pfVar1[1];
          fVar251 = pfVar1[2];
          fVar257 = pfVar1[3];
          fVar305 = local_128 * fVar177 + fVar180 * fVar219 + fVar204 * fVar249 + fVar106 * fVar240;
          fVar161 = fStack_124 * fVar205 + fVar180 * fVar228 + fVar204 * fVar250 + fVar106 * fVar241
          ;
          fVar164 = fStack_120 * fVar211 + fVar180 * fVar231 + fVar204 * fVar284 + fVar106 * fVar251
          ;
          fVar179 = fStack_11c * fVar214 + fVar180 * fVar242 + fVar204 * fVar236 + fVar106 * fVar257
          ;
          fVar207 = local_298 * fVar177 +
                    local_2a8 * fVar219 + local_318 * fVar249 + local_288 * fVar240;
          fVar212 = fStack_294 * fVar205 +
                    fStack_2a4 * fVar228 + fStack_314 * fVar250 + fStack_284 * fVar241;
          fVar213 = fStack_290 * fVar211 +
                    fStack_2a0 * fVar231 + fStack_310 * fVar284 + fStack_280 * fVar251;
          fVar215 = fStack_28c * fVar214 +
                    fStack_29c * fVar242 + fStack_30c * fVar236 + fStack_27c * fVar257;
          auVar298._0_4_ =
               local_178 * fVar177 + local_168 * fVar219 + local_258 * fVar249 + local_58 * fVar240;
          auVar298._4_4_ =
               fStack_174 * fVar205 +
               fStack_164 * fVar228 + fStack_254 * fVar250 + fStack_54 * fVar241;
          auVar298._8_4_ =
               fStack_170 * fVar211 +
               fStack_160 * fVar231 + fStack_250 * fVar284 + fStack_50 * fVar251;
          auVar298._12_4_ =
               fStack_16c * fVar214 +
               fStack_15c * fVar242 + fStack_24c * fVar236 + fStack_4c * fVar257;
          fVar150 = fVar305 - fVar216;
          fVar163 = fVar161 - fVar217;
          fVar178 = fVar164 - fVar218;
          fVar206 = fVar179 - fVar220;
          fVar285 = fVar207 - fVar229;
          fVar291 = fVar212 - fVar234;
          fVar293 = fVar213 - fVar303;
          fVar295 = fVar215 - fVar286;
          fVar232 = fVar229 * fVar150 - fVar216 * fVar285;
          fVar301 = fVar234 * fVar163 - fVar217 * fVar291;
          fVar306 = fVar303 * fVar178 - fVar218 * fVar293;
          fVar292 = fVar286 * fVar206 - fVar220 * fVar295;
          auVar75 = maxps(auVar131,auVar298);
          bVar48 = fVar232 * fVar232 <=
                   auVar75._0_4_ * auVar75._0_4_ * (fVar150 * fVar150 + fVar285 * fVar285) &&
                   (int)uVar68 < local_68;
          auVar227._0_4_ = -(uint)bVar48;
          bVar49 = fVar301 * fVar301 <=
                   auVar75._4_4_ * auVar75._4_4_ * (fVar163 * fVar163 + fVar291 * fVar291) &&
                   (int)(uVar68 | 1) < iStack_64;
          auVar227._4_4_ = -(uint)bVar49;
          bVar50 = fVar306 * fVar306 <=
                   auVar75._8_4_ * auVar75._8_4_ * (fVar178 * fVar178 + fVar293 * fVar293) &&
                   (int)(uVar68 | 2) < iStack_60;
          auVar227._8_4_ = -(uint)bVar50;
          bVar51 = fVar292 * fVar292 <=
                   auVar75._12_4_ * auVar75._12_4_ * (fVar206 * fVar206 + fVar295 * fVar295) &&
                   (int)(uVar68 | 3) < iStack_5c;
          auVar227._12_4_ = -(uint)bVar51;
          uVar67 = movmskps((int)pGVar61,auVar227);
          pGVar61 = (Geometry *)(ulong)uVar67;
          if (uVar67 != 0) {
            local_2b8 = CONCAT44(fVar163,fVar150);
            fVar294 = fVar240 * local_278 + fVar249 * fVar165 + fVar219 * local_328 +
                      fVar177 * fVar203;
            fVar296 = fVar241 * fStack_274 + fVar250 * fVar165 + fVar228 * fStack_324 +
                      fVar205 * fVar203;
            fVar74 = fVar251 * fStack_270 + fVar284 * fVar165 + fVar231 * fStack_320 +
                     fVar211 * fVar203;
            fVar107 = fVar257 * fStack_26c + fVar236 * fVar165 + fVar242 * fStack_31c +
                      fVar214 * fVar203;
            fVar134 = fVar149 * local_278 + local_348 * fVar165 + fVar133 * local_328 +
                      fVar148 * fVar203;
            fVar135 = fVar160 * fStack_274 + fStack_344 * fVar165 + fVar136 * fStack_324 +
                      fVar73 * fVar203;
            fVar137 = fVar162 * fStack_270 + fStack_340 * fVar165 + fVar141 * fStack_320 +
                      fVar108 * fVar203;
            fVar138 = fVar176 * fStack_26c + fStack_33c * fVar165 + fVar147 * fStack_31c +
                      fVar111 * fVar203;
            pfVar1 = (float *)(lVar22 + 0x22284f4 + lVar62 * 4);
            fVar148 = *pfVar1;
            fVar73 = pfVar1[1];
            fVar108 = pfVar1[2];
            fVar111 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2228978 + lVar62 * 4);
            fVar133 = *pfVar1;
            fVar136 = pfVar1[1];
            fVar141 = pfVar1[2];
            fVar147 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2228dfc + lVar62 * 4);
            fVar149 = *pfVar1;
            fVar160 = pfVar1[1];
            fVar162 = pfVar1[2];
            fVar176 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x2229280 + lVar62 * 4);
            fVar177 = *pfVar1;
            fVar205 = pfVar1[1];
            fVar211 = pfVar1[2];
            fVar214 = pfVar1[3];
            fVar233 = local_128 * fVar148 +
                      fVar180 * fVar133 + fVar204 * fVar149 + fVar106 * fVar177;
            fVar235 = fStack_124 * fVar73 +
                      fVar180 * fVar136 + fVar204 * fVar160 + fVar106 * fVar205;
            fVar252 = fStack_120 * fVar108 +
                      fVar180 * fVar141 + fVar204 * fVar162 + fVar106 * fVar211;
            fVar258 = fStack_11c * fVar111 +
                      fVar180 * fVar147 + fVar204 * fVar176 + fVar106 * fVar214;
            fVar109 = local_298 * fVar148 +
                      local_2a8 * fVar133 + local_318 * fVar149 + local_288 * fVar177;
            fVar110 = fStack_294 * fVar73 +
                      fStack_2a4 * fVar136 + fStack_314 * fVar160 + fStack_284 * fVar205;
            fVar112 = fStack_290 * fVar108 +
                      fStack_2a0 * fVar141 + fStack_310 * fVar162 + fStack_280 * fVar211;
            fVar113 = fStack_28c * fVar111 +
                      fStack_29c * fVar147 + fStack_30c * fVar176 + fStack_27c * fVar214;
            pfVar1 = (float *)(lVar22 + 0x222a914 + lVar62 * 4);
            fVar219 = *pfVar1;
            fVar228 = pfVar1[1];
            fVar231 = pfVar1[2];
            fVar242 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222b21c + lVar62 * 4);
            fVar249 = *pfVar1;
            fVar250 = pfVar1[1];
            fVar284 = pfVar1[2];
            fVar236 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222b6a0 + lVar62 * 4);
            fVar240 = *pfVar1;
            fVar241 = pfVar1[1];
            fVar251 = pfVar1[2];
            fVar257 = pfVar1[3];
            pfVar1 = (float *)(lVar22 + 0x222ad98 + lVar62 * 4);
            fVar232 = *pfVar1;
            fVar301 = pfVar1[1];
            fVar306 = pfVar1[2];
            fVar292 = pfVar1[3];
            fVar260 = local_128 * fVar219 +
                      fVar180 * fVar232 + fVar204 * fVar249 + fVar106 * fVar240;
            fVar261 = fStack_124 * fVar228 +
                      fVar180 * fVar301 + fVar204 * fVar250 + fVar106 * fVar241;
            fVar300 = fStack_120 * fVar231 +
                      fVar180 * fVar306 + fVar204 * fVar284 + fVar106 * fVar251;
            fVar302 = fStack_11c * fVar242 +
                      fVar180 * fVar292 + fVar204 * fVar236 + fVar106 * fVar257;
            fVar139 = local_298 * fVar219 +
                      local_2a8 * fVar232 + local_318 * fVar249 + local_288 * fVar240;
            fVar140 = fStack_294 * fVar228 +
                      fStack_2a4 * fVar301 + fStack_314 * fVar250 + fStack_284 * fVar241;
            fVar221 = fStack_290 * fVar231 +
                      fStack_2a0 * fVar306 + fStack_310 * fVar284 + fStack_280 * fVar251;
            fVar230 = fStack_28c * fVar242 +
                      fStack_29c * fVar292 + fStack_30c * fVar236 + fStack_27c * fVar257;
            auVar280._0_8_ = CONCAT44(fVar235,fVar233) & 0x7fffffff7fffffff;
            auVar280._8_4_ = ABS(fVar252);
            auVar280._12_4_ = ABS(fVar258);
            auVar200._0_8_ = CONCAT44(fVar110,fVar109) & 0x7fffffff7fffffff;
            auVar200._8_4_ = ABS(fVar112);
            auVar200._12_4_ = ABS(fVar113);
            auVar75 = maxps(auVar280,auVar200);
            auVar289._0_8_ =
                 CONCAT44(fVar73 * fVar203 +
                          fVar136 * fStack_324 + fVar160 * fVar165 + fVar205 * fStack_274,
                          fVar148 * fVar203 +
                          fVar133 * local_328 + fVar149 * fVar165 + fVar177 * local_278) &
                 0x7fffffff7fffffff;
            auVar289._8_4_ =
                 ABS(fVar108 * fVar203 +
                     fVar141 * fStack_320 + fVar162 * fVar165 + fVar211 * fStack_270);
            auVar289._12_4_ =
                 ABS(fVar111 * fVar203 +
                     fVar147 * fStack_31c + fVar176 * fVar165 + fVar214 * fStack_26c);
            auVar75 = maxps(auVar75,auVar289);
            uVar67 = -(uint)(local_388 <= auVar75._0_4_);
            uVar69 = -(uint)(fStack_384 <= auVar75._4_4_);
            uVar70 = -(uint)(fStack_380 <= auVar75._8_4_);
            uVar71 = -(uint)(fStack_37c <= auVar75._12_4_);
            auVar201._0_4_ = ~uVar67 & (uint)fVar150;
            auVar201._4_4_ = ~uVar69 & (uint)fVar163;
            auVar201._8_4_ = ~uVar70 & (uint)fVar178;
            auVar201._12_4_ = ~uVar71 & (uint)fVar206;
            auVar268._0_4_ = (uint)fVar233 & uVar67;
            auVar268._4_4_ = (uint)fVar235 & uVar69;
            auVar268._8_4_ = (uint)fVar252 & uVar70;
            auVar268._12_4_ = (uint)fVar258 & uVar71;
            auVar268 = auVar268 | auVar201;
            fVar109 = (float)(~uVar67 & (uint)fVar285 | (uint)fVar109 & uVar67);
            fVar110 = (float)(~uVar69 & (uint)fVar291 | (uint)fVar110 & uVar69);
            fVar112 = (float)(~uVar70 & (uint)fVar293 | (uint)fVar112 & uVar70);
            fVar113 = (float)(~uVar71 & (uint)fVar295 | (uint)fVar113 & uVar71);
            auVar290._0_8_ = CONCAT44(fVar261,fVar260) & 0x7fffffff7fffffff;
            auVar290._8_4_ = ABS(fVar300);
            auVar290._12_4_ = ABS(fVar302);
            auVar144._0_8_ = CONCAT44(fVar140,fVar139) & 0x7fffffff7fffffff;
            auVar144._8_4_ = ABS(fVar221);
            auVar144._12_4_ = ABS(fVar230);
            auVar75 = maxps(auVar290,auVar144);
            auVar100._0_8_ =
                 CONCAT44(fVar228 * fVar203 +
                          fVar301 * fStack_324 + fVar250 * fVar165 + fVar241 * fStack_274,
                          fVar219 * fVar203 +
                          fVar232 * local_328 + fVar249 * fVar165 + fVar240 * local_278) &
                 0x7fffffff7fffffff;
            auVar100._8_4_ =
                 ABS(fVar231 * fVar203 +
                     fVar306 * fStack_320 + fVar284 * fVar165 + fVar251 * fStack_270);
            auVar100._12_4_ =
                 ABS(fVar242 * fVar203 +
                     fVar292 * fStack_31c + fVar236 * fVar165 + fVar257 * fStack_26c);
            auVar75 = maxps(auVar75,auVar100);
            uVar67 = -(uint)(local_388 <= auVar75._0_4_);
            uVar69 = -(uint)(fStack_384 <= auVar75._4_4_);
            uVar70 = -(uint)(fStack_380 <= auVar75._8_4_);
            uVar71 = -(uint)(fStack_37c <= auVar75._12_4_);
            fVar240 = (float)((uint)fVar260 & uVar67 | ~uVar67 & (uint)fVar150);
            fVar251 = (float)((uint)fVar261 & uVar69 | ~uVar69 & (uint)fVar163);
            fVar252 = (float)((uint)fVar300 & uVar70 | ~uVar70 & (uint)fVar178);
            fVar258 = (float)((uint)fVar302 & uVar71 | ~uVar71 & (uint)fVar206);
            fVar219 = (float)(~uVar67 & (uint)fVar285 | (uint)fVar139 & uVar67);
            fVar231 = (float)(~uVar69 & (uint)fVar291 | (uint)fVar140 & uVar69);
            fVar249 = (float)(~uVar70 & (uint)fVar293 | (uint)fVar221 & uVar70);
            fVar284 = (float)(~uVar71 & (uint)fVar295 | (uint)fVar230 & uVar71);
            fVar147 = auVar268._0_4_;
            fVar148 = auVar268._4_4_;
            fVar73 = auVar268._8_4_;
            fVar108 = auVar268._12_4_;
            auVar172._0_4_ = fVar109 * fVar109 + fVar147 * fVar147;
            auVar172._4_4_ = fVar110 * fVar110 + fVar148 * fVar148;
            auVar172._8_4_ = fVar112 * fVar112 + fVar73 * fVar73;
            auVar172._12_4_ = fVar113 * fVar113 + fVar108 * fVar108;
            auVar75 = rsqrtps(auVar201,auVar172);
            fVar111 = auVar75._0_4_;
            fVar133 = auVar75._4_4_;
            fVar136 = auVar75._8_4_;
            fVar141 = auVar75._12_4_;
            auVar202._0_4_ = fVar111 * fVar111 * auVar172._0_4_ * 0.5 * fVar111;
            auVar202._4_4_ = fVar133 * fVar133 * auVar172._4_4_ * 0.5 * fVar133;
            auVar202._8_4_ = fVar136 * fVar136 * auVar172._8_4_ * 0.5 * fVar136;
            auVar202._12_4_ = fVar141 * fVar141 * auVar172._12_4_ * 0.5 * fVar141;
            fVar177 = fVar111 * 1.5 - auVar202._0_4_;
            fVar205 = fVar133 * 1.5 - auVar202._4_4_;
            fVar211 = fVar136 * 1.5 - auVar202._8_4_;
            fVar214 = fVar141 * 1.5 - auVar202._12_4_;
            auVar173._0_4_ = fVar219 * fVar219 + fVar240 * fVar240;
            auVar173._4_4_ = fVar231 * fVar231 + fVar251 * fVar251;
            auVar173._8_4_ = fVar249 * fVar249 + fVar252 * fVar252;
            auVar173._12_4_ = fVar284 * fVar284 + fVar258 * fVar258;
            auVar75 = rsqrtps(auVar202,auVar173);
            fVar111 = auVar75._0_4_;
            fVar133 = auVar75._4_4_;
            fVar136 = auVar75._8_4_;
            fVar141 = auVar75._12_4_;
            fVar149 = fVar111 * 1.5 - fVar111 * fVar111 * auVar173._0_4_ * 0.5 * fVar111;
            fVar160 = fVar133 * 1.5 - fVar133 * fVar133 * auVar173._4_4_ * 0.5 * fVar133;
            fVar162 = fVar136 * 1.5 - fVar136 * fVar136 * auVar173._8_4_ * 0.5 * fVar136;
            fVar176 = fVar141 * 1.5 - fVar141 * fVar141 * auVar173._12_4_ * 0.5 * fVar141;
            fVar241 = fVar109 * fVar177 * auVar131._0_4_;
            fVar257 = fVar110 * fVar205 * auVar131._4_4_;
            fVar291 = fVar112 * fVar211 * auVar131._8_4_;
            fVar295 = fVar113 * fVar214 * auVar131._12_4_;
            fVar133 = -fVar147 * fVar177 * auVar131._0_4_;
            fVar136 = -fVar148 * fVar205 * auVar131._4_4_;
            fVar141 = -fVar73 * fVar211 * auVar131._8_4_;
            fVar147 = -fVar108 * fVar214 * auVar131._12_4_;
            fVar228 = fVar177 * 0.0 * auVar131._0_4_;
            fVar242 = fVar205 * 0.0 * auVar131._4_4_;
            fVar250 = fVar211 * 0.0 * auVar131._8_4_;
            fVar236 = fVar214 * 0.0 * auVar131._12_4_;
            fVar150 = fVar219 * fVar149 * auVar298._0_4_;
            fVar163 = fVar231 * fVar160 * auVar298._4_4_;
            fVar233 = fVar249 * fVar162 * auVar298._8_4_;
            fVar235 = fVar284 * fVar176 * auVar298._12_4_;
            fVar232 = fVar305 + fVar150;
            fVar301 = fVar161 + fVar163;
            fVar306 = fVar164 + fVar233;
            fVar292 = fVar179 + fVar235;
            fVar148 = -fVar240 * fVar149 * auVar298._0_4_;
            fVar73 = -fVar251 * fVar160 * auVar298._4_4_;
            fVar108 = -fVar252 * fVar162 * auVar298._8_4_;
            fVar111 = -fVar258 * fVar176 * auVar298._12_4_;
            fVar109 = fVar207 + fVar148;
            fVar110 = fVar212 + fVar73;
            fVar112 = fVar213 + fVar108;
            fVar113 = fVar215 + fVar111;
            fVar177 = fVar149 * 0.0 * auVar298._0_4_;
            fVar205 = fVar160 * 0.0 * auVar298._4_4_;
            fVar211 = fVar162 * 0.0 * auVar298._8_4_;
            fVar214 = fVar176 * 0.0 * auVar298._12_4_;
            fVar219 = fVar216 - fVar241;
            fVar231 = fVar217 - fVar257;
            fVar249 = fVar218 - fVar291;
            fVar284 = fVar220 - fVar295;
            fVar139 = fVar294 + fVar177;
            fVar140 = fVar296 + fVar205;
            fVar221 = fVar74 + fVar211;
            fVar230 = fVar107 + fVar214;
            fVar240 = fVar229 - fVar133;
            fVar251 = fVar234 - fVar136;
            fVar285 = fVar303 - fVar141;
            fVar293 = fVar286 - fVar147;
            fVar149 = fVar134 - fVar228;
            fVar160 = fVar135 - fVar242;
            fVar162 = fVar137 - fVar250;
            fVar176 = fVar138 - fVar236;
            uVar67 = -(uint)(0.0 < (fVar240 * (fVar139 - fVar149) - fVar149 * (fVar109 - fVar240)) *
                                   0.0 + (fVar149 * (fVar232 - fVar219) -
                                         (fVar139 - fVar149) * fVar219) * 0.0 +
                                         ((fVar109 - fVar240) * fVar219 -
                                         (fVar232 - fVar219) * fVar240));
            uVar69 = -(uint)(0.0 < (fVar251 * (fVar140 - fVar160) - fVar160 * (fVar110 - fVar251)) *
                                   0.0 + (fVar160 * (fVar301 - fVar231) -
                                         (fVar140 - fVar160) * fVar231) * 0.0 +
                                         ((fVar110 - fVar251) * fVar231 -
                                         (fVar301 - fVar231) * fVar251));
            uVar70 = -(uint)(0.0 < (fVar285 * (fVar221 - fVar162) - fVar162 * (fVar112 - fVar285)) *
                                   0.0 + (fVar162 * (fVar306 - fVar249) -
                                         (fVar221 - fVar162) * fVar249) * 0.0 +
                                         ((fVar112 - fVar285) * fVar249 -
                                         (fVar306 - fVar249) * fVar285));
            uVar71 = -(uint)(0.0 < (fVar293 * (fVar230 - fVar176) - fVar176 * (fVar113 - fVar293)) *
                                   0.0 + (fVar176 * (fVar292 - fVar284) -
                                         (fVar230 - fVar176) * fVar284) * 0.0 +
                                         ((fVar113 - fVar293) * fVar284 -
                                         (fVar292 - fVar284) * fVar293));
            fVar305 = (float)((uint)(fVar305 - fVar150) & uVar67 |
                             ~uVar67 & (uint)(fVar216 + fVar241));
            fVar150 = (float)((uint)(fVar161 - fVar163) & uVar69 |
                             ~uVar69 & (uint)(fVar217 + fVar257));
            fVar161 = (float)((uint)(fVar164 - fVar233) & uVar70 |
                             ~uVar70 & (uint)(fVar218 + fVar291));
            fVar163 = (float)((uint)(fVar179 - fVar235) & uVar71 |
                             ~uVar71 & (uint)(fVar220 + fVar295));
            fVar218 = (float)((uint)(fVar207 - fVar148) & uVar67 |
                             ~uVar67 & (uint)(fVar229 + fVar133));
            fVar220 = (float)((uint)(fVar212 - fVar73) & uVar69 |
                             ~uVar69 & (uint)(fVar234 + fVar136));
            fVar229 = (float)((uint)(fVar213 - fVar108) & uVar70 |
                             ~uVar70 & (uint)(fVar303 + fVar141));
            fVar234 = (float)((uint)(fVar215 - fVar111) & uVar71 |
                             ~uVar71 & (uint)(fVar286 + fVar147));
            fVar133 = (float)((uint)(fVar294 - fVar177) & uVar67 |
                             ~uVar67 & (uint)(fVar134 + fVar228));
            fVar136 = (float)((uint)(fVar296 - fVar205) & uVar69 |
                             ~uVar69 & (uint)(fVar135 + fVar242));
            fVar141 = (float)((uint)(fVar74 - fVar211) & uVar70 |
                             ~uVar70 & (uint)(fVar137 + fVar250));
            fVar147 = (float)((uint)(fVar107 - fVar214) & uVar71 |
                             ~uVar71 & (uint)(fVar138 + fVar236));
            fVar228 = (float)((uint)fVar219 & uVar67 | ~uVar67 & (uint)fVar232);
            fVar242 = (float)((uint)fVar231 & uVar69 | ~uVar69 & (uint)fVar301);
            fVar250 = (float)((uint)fVar249 & uVar70 | ~uVar70 & (uint)fVar306);
            fVar236 = (float)((uint)fVar284 & uVar71 | ~uVar71 & (uint)fVar292);
            fVar241 = (float)((uint)fVar240 & uVar67 | ~uVar67 & (uint)fVar109);
            fVar257 = (float)((uint)fVar251 & uVar69 | ~uVar69 & (uint)fVar110);
            fVar291 = (float)((uint)fVar285 & uVar70 | ~uVar70 & (uint)fVar112);
            fVar295 = (float)((uint)fVar293 & uVar71 | ~uVar71 & (uint)fVar113);
            fVar177 = (float)((uint)fVar149 & uVar67 | ~uVar67 & (uint)fVar139);
            fVar205 = (float)((uint)fVar160 & uVar69 | ~uVar69 & (uint)fVar140);
            fVar211 = (float)((uint)fVar162 & uVar70 | ~uVar70 & (uint)fVar221);
            fVar214 = (float)((uint)fVar176 & uVar71 | ~uVar71 & (uint)fVar230);
            fVar219 = (float)((uint)fVar232 & uVar67 | ~uVar67 & (uint)fVar219) - fVar305;
            fVar231 = (float)((uint)fVar301 & uVar69 | ~uVar69 & (uint)fVar231) - fVar150;
            fVar249 = (float)((uint)fVar306 & uVar70 | ~uVar70 & (uint)fVar249) - fVar161;
            fVar284 = (float)((uint)fVar292 & uVar71 | ~uVar71 & (uint)fVar284) - fVar163;
            fVar240 = (float)((uint)fVar109 & uVar67 | ~uVar67 & (uint)fVar240) - fVar218;
            fVar251 = (float)((uint)fVar110 & uVar69 | ~uVar69 & (uint)fVar251) - fVar220;
            fVar285 = (float)((uint)fVar112 & uVar70 | ~uVar70 & (uint)fVar285) - fVar229;
            fVar293 = (float)((uint)fVar113 & uVar71 | ~uVar71 & (uint)fVar293) - fVar234;
            fVar164 = (float)((uint)fVar139 & uVar67 | ~uVar67 & (uint)fVar149) - fVar133;
            fVar179 = (float)((uint)fVar140 & uVar69 | ~uVar69 & (uint)fVar160) - fVar136;
            fVar207 = (float)((uint)fVar221 & uVar70 | ~uVar70 & (uint)fVar162) - fVar141;
            fVar212 = (float)((uint)fVar230 & uVar71 | ~uVar71 & (uint)fVar176) - fVar147;
            fVar232 = fVar305 - fVar228;
            fVar301 = fVar150 - fVar242;
            fVar303 = fVar161 - fVar250;
            fVar306 = fVar163 - fVar236;
            fVar148 = fVar218 - fVar241;
            fVar73 = fVar220 - fVar257;
            fVar108 = fVar229 - fVar291;
            fVar111 = fVar234 - fVar295;
            fVar149 = fVar133 - fVar177;
            fVar160 = fVar136 - fVar205;
            fVar162 = fVar141 - fVar211;
            fVar176 = fVar147 - fVar214;
            fVar213 = (fVar218 * fVar164 - fVar133 * fVar240) * 0.0 +
                      (fVar133 * fVar219 - fVar305 * fVar164) * 0.0 +
                      (fVar305 * fVar240 - fVar218 * fVar219);
            fVar215 = (fVar220 * fVar179 - fVar136 * fVar251) * 0.0 +
                      (fVar136 * fVar231 - fVar150 * fVar179) * 0.0 +
                      (fVar150 * fVar251 - fVar220 * fVar231);
            auVar158._4_4_ = fVar215;
            auVar158._0_4_ = fVar213;
            fVar216 = (fVar229 * fVar207 - fVar141 * fVar285) * 0.0 +
                      (fVar141 * fVar249 - fVar161 * fVar207) * 0.0 +
                      (fVar161 * fVar285 - fVar229 * fVar249);
            fVar217 = (fVar234 * fVar212 - fVar147 * fVar293) * 0.0 +
                      (fVar147 * fVar284 - fVar163 * fVar212) * 0.0 +
                      (fVar163 * fVar293 - fVar234 * fVar284);
            auVar299._0_4_ =
                 (fVar241 * fVar149 - fVar177 * fVar148) * 0.0 +
                 (fVar177 * fVar232 - fVar228 * fVar149) * 0.0 +
                 (fVar228 * fVar148 - fVar241 * fVar232);
            auVar299._4_4_ =
                 (fVar257 * fVar160 - fVar205 * fVar73) * 0.0 +
                 (fVar205 * fVar301 - fVar242 * fVar160) * 0.0 +
                 (fVar242 * fVar73 - fVar257 * fVar301);
            auVar299._8_4_ =
                 (fVar291 * fVar162 - fVar211 * fVar108) * 0.0 +
                 (fVar211 * fVar303 - fVar250 * fVar162) * 0.0 +
                 (fVar250 * fVar108 - fVar291 * fVar303);
            auVar299._12_4_ =
                 (fVar295 * fVar176 - fVar214 * fVar111) * 0.0 +
                 (fVar214 * fVar306 - fVar236 * fVar176) * 0.0 +
                 (fVar236 * fVar111 - fVar295 * fVar306);
            auVar158._8_4_ = fVar216;
            auVar158._12_4_ = fVar217;
            auVar75 = maxps(auVar158,auVar299);
            bVar48 = auVar75._0_4_ <= 0.0 && bVar48;
            auVar159._0_4_ = -(uint)bVar48;
            bVar49 = auVar75._4_4_ <= 0.0 && bVar49;
            auVar159._4_4_ = -(uint)bVar49;
            bVar50 = auVar75._8_4_ <= 0.0 && bVar50;
            auVar159._8_4_ = -(uint)bVar50;
            bVar51 = auVar75._12_4_ <= 0.0 && bVar51;
            auVar159._12_4_ = -(uint)bVar51;
            iVar52 = movmskps((int)(bezier_basis1 + lVar22),auVar159);
            if (iVar52 == 0) {
              auVar146._8_8_ = uStack_3a0;
              auVar146._0_8_ = local_3a8;
              iVar52 = 0;
            }
            else {
              fVar205 = fVar148 * fVar164 - fVar149 * fVar240;
              fVar211 = fVar73 * fVar179 - fVar160 * fVar251;
              fVar214 = fVar108 * fVar207 - fVar162 * fVar285;
              fVar228 = fVar111 * fVar212 - fVar176 * fVar293;
              fVar177 = fVar149 * fVar219 - fVar164 * fVar232;
              fVar160 = fVar160 * fVar231 - fVar179 * fVar301;
              fVar162 = fVar162 * fVar249 - fVar207 * fVar303;
              fVar176 = fVar176 * fVar284 - fVar212 * fVar306;
              fVar148 = fVar232 * fVar240 - fVar148 * fVar219;
              fVar219 = fVar301 * fVar251 - fVar73 * fVar231;
              fVar231 = fVar303 * fVar285 - fVar108 * fVar249;
              fVar242 = fVar306 * fVar293 - fVar111 * fVar284;
              auVar145._0_4_ = fVar177 * 0.0 + fVar148;
              auVar145._4_4_ = fVar160 * 0.0 + fVar219;
              auVar145._8_4_ = fVar162 * 0.0 + fVar231;
              auVar145._12_4_ = fVar176 * 0.0 + fVar242;
              auVar210._0_4_ = fVar205 * 0.0 + auVar145._0_4_;
              auVar210._4_4_ = fVar211 * 0.0 + auVar145._4_4_;
              auVar210._8_4_ = fVar214 * 0.0 + auVar145._8_4_;
              auVar210._12_4_ = fVar228 * 0.0 + auVar145._12_4_;
              auVar75 = rcpps(auVar145,auVar210);
              fVar73 = auVar75._0_4_;
              fVar108 = auVar75._4_4_;
              fVar111 = auVar75._8_4_;
              fVar149 = auVar75._12_4_;
              fVar73 = (1.0 - auVar210._0_4_ * fVar73) * fVar73 + fVar73;
              fVar108 = (1.0 - auVar210._4_4_ * fVar108) * fVar108 + fVar108;
              fVar111 = (1.0 - auVar210._8_4_ * fVar111) * fVar111 + fVar111;
              fVar149 = (1.0 - auVar210._12_4_ * fVar149) * fVar149 + fVar149;
              fVar133 = (fVar133 * fVar148 + fVar218 * fVar177 + fVar305 * fVar205) * fVar73;
              fVar136 = (fVar136 * fVar219 + fVar220 * fVar160 + fVar150 * fVar211) * fVar108;
              fVar141 = (fVar141 * fVar231 + fVar229 * fVar162 + fVar161 * fVar214) * fVar111;
              fVar147 = (fVar147 * fVar242 + fVar234 * fVar176 + fVar163 * fVar228) * fVar149;
              fVar148 = *(float *)(ray + k * 4 + 0x80);
              bVar48 = (fVar133 <= fVar148 && local_398 <= fVar133) && bVar48;
              auVar174._0_4_ = -(uint)bVar48;
              bVar49 = (fVar136 <= fVar148 && fStack_394 <= fVar136) && bVar49;
              auVar174._4_4_ = -(uint)bVar49;
              bVar50 = (fVar141 <= fVar148 && fStack_390 <= fVar141) && bVar50;
              auVar174._8_4_ = -(uint)bVar50;
              bVar51 = (fVar147 <= fVar148 && fStack_38c <= fVar147) && bVar51;
              auVar174._12_4_ = -(uint)bVar51;
              iVar52 = movmskps(iVar52,auVar174);
              if (iVar52 == 0) {
                auVar146._8_8_ = uStack_3a0;
                auVar146._0_8_ = local_3a8;
                iVar52 = 0;
              }
              else {
                auVar175._0_8_ =
                     CONCAT44(-(uint)(auVar210._4_4_ != 0.0 && bVar49),
                              -(uint)(auVar210._0_4_ != 0.0 && bVar48));
                auVar175._8_4_ = -(uint)(auVar210._8_4_ != 0.0 && bVar50);
                auVar175._12_4_ = -(uint)(auVar210._12_4_ != 0.0 && bVar51);
                iVar52 = movmskps(iVar52,auVar175);
                auVar146._8_8_ = uStack_3a0;
                auVar146._0_8_ = local_3a8;
                if (iVar52 != 0) {
                  fVar213 = fVar213 * fVar73;
                  fVar215 = fVar215 * fVar108;
                  fVar216 = fVar216 * fVar111;
                  fVar217 = fVar217 * fVar149;
                  local_358 = (float)((uint)(1.0 - fVar213) & uVar67 | ~uVar67 & (uint)fVar213);
                  fStack_354 = (float)((uint)(1.0 - fVar215) & uVar69 | ~uVar69 & (uint)fVar215);
                  fStack_350 = (float)((uint)(1.0 - fVar216) & uVar70 | ~uVar70 & (uint)fVar216);
                  fStack_34c = (float)((uint)(1.0 - fVar217) & uVar71 | ~uVar71 & (uint)fVar217);
                  local_368 = (float)(~uVar67 & (uint)(auVar299._0_4_ * fVar73) |
                                     (uint)(1.0 - auVar299._0_4_ * fVar73) & uVar67);
                  fStack_364 = (float)(~uVar69 & (uint)(auVar299._4_4_ * fVar108) |
                                      (uint)(1.0 - auVar299._4_4_ * fVar108) & uVar69);
                  fStack_360 = (float)(~uVar70 & (uint)(auVar299._8_4_ * fVar111) |
                                      (uint)(1.0 - auVar299._8_4_ * fVar111) & uVar70);
                  fStack_35c = (float)(~uVar71 & (uint)(auVar299._12_4_ * fVar149) |
                                      (uint)(1.0 - auVar299._12_4_ * fVar149) & uVar71);
                  auVar146._8_4_ = auVar175._8_4_;
                  auVar146._0_8_ = auVar175._0_8_;
                  auVar146._12_4_ = auVar175._12_4_;
                  local_378 = fVar133;
                  fStack_374 = fVar136;
                  fStack_370 = fVar141;
                  fStack_36c = fVar147;
                }
              }
            }
            iVar52 = movmskps(iVar52,auVar146);
            fStack_2b0 = fVar178;
            fStack_2ac = fVar206;
            if (iVar52 != 0) {
              fVar73 = (auVar298._0_4_ - auVar131._0_4_) * local_358 + auVar131._0_4_;
              fVar108 = (auVar298._4_4_ - auVar131._4_4_) * fStack_354 + auVar131._4_4_;
              fVar111 = (auVar298._8_4_ - auVar131._8_4_) * fStack_350 + auVar131._8_4_;
              fVar133 = (auVar298._12_4_ - auVar131._12_4_) * fStack_34c + auVar131._12_4_;
              fVar148 = *(float *)((long)local_300->ray_space + k * 4 + -0x10);
              auVar101._0_4_ = -(uint)(fVar148 * (fVar73 + fVar73) < local_378) & auVar146._0_4_;
              auVar101._4_4_ = -(uint)(fVar148 * (fVar108 + fVar108) < fStack_374) & auVar146._4_4_;
              auVar101._8_4_ = -(uint)(fVar148 * (fVar111 + fVar111) < fStack_370) & auVar146._8_4_;
              auVar101._12_4_ =
                   -(uint)(fVar148 * (fVar133 + fVar133) < fStack_36c) & auVar146._12_4_;
              uVar67 = movmskps((int)local_300,auVar101);
              if (uVar67 != 0) {
                local_368 = local_368 + local_368 + -1.0;
                fStack_364 = fStack_364 + fStack_364 + -1.0;
                fStack_360 = fStack_360 + fStack_360 + -1.0;
                fStack_35c = fStack_35c + fStack_35c + -1.0;
                local_1f8 = CONCAT44(fStack_334,local_338);
                uStack_1f0 = CONCAT44(fStack_32c,fStack_330);
                local_1e8 = CONCAT44(fStack_144,local_148);
                uStack_1e0 = CONCAT44(fStack_13c,fStack_140);
                local_1d8 = CONCAT44(fStack_154,local_158);
                uStack_1d0 = CONCAT44(fStack_14c,fStack_150);
                local_1c8 = CONCAT44(fStack_134,local_138);
                uStack_1c0 = CONCAT44(fStack_12c,fStack_130);
                pGVar61 = (context->scene->geometries).items[local_3b0].ptr;
                local_238 = local_358;
                fStack_234 = fStack_354;
                fStack_230 = fStack_350;
                fStack_22c = fStack_34c;
                local_228 = local_368;
                fStack_224 = fStack_364;
                fStack_220 = fStack_360;
                fStack_21c = fStack_35c;
                local_218 = local_378;
                fStack_214 = fStack_374;
                fStack_210 = fStack_370;
                fStack_20c = fStack_36c;
                local_208 = uVar68;
                local_1b8 = auVar101;
                if ((pGVar61->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                  puVar59 = (undefined1 *)0x0;
                  local_204 = iVar17;
                }
                else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                        (puVar59 = (undefined1 *)CONCAT71((int7)((ulong)context->args >> 8),1),
                        local_204 = iVar17, pGVar61->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                  fVar148 = (float)(int)uVar68;
                  local_1a8[0] = (fVar148 + local_358 + 0.0) * local_88;
                  local_1a8[1] = (fVar148 + fStack_354 + 1.0) * fStack_84;
                  local_1a8[2] = (fVar148 + fStack_350 + 2.0) * fStack_80;
                  local_1a8[3] = (fVar148 + fStack_34c + 3.0) * fStack_7c;
                  local_198 = CONCAT44(fStack_364,local_368);
                  uStack_190 = CONCAT44(fStack_35c,fStack_360);
                  local_188[0] = local_378;
                  local_188[1] = fStack_374;
                  local_188[2] = fStack_370;
                  local_188[3] = fStack_36c;
                  uVar63 = (ulong)(uVar67 & 0xff);
                  uVar64 = 0;
                  if (uVar63 != 0) {
                    for (; ((uVar67 & 0xff) >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                    }
                  }
                  uVar24 = *local_308;
                  uVar25 = local_308[1];
                  local_438._0_4_ = (uint)CONCAT71((int7)((ulong)local_308 >> 8),1);
                  local_204 = iVar17;
                  do {
                    local_e8 = local_1a8[uVar64];
                    uVar57 = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_d8 = *(undefined4 *)((long)&local_198 + uVar64 * 4);
                    *(float *)(ray + k * 4 + 0x80) = local_188[uVar64];
                    fVar148 = 1.0 - local_e8;
                    fVar108 = local_e8 * fVar148 + local_e8 * fVar148;
                    fVar111 = (fVar108 - local_e8 * local_e8) * 3.0;
                    fVar73 = local_e8 * local_e8 * 3.0;
                    fVar108 = (fVar148 * fVar148 - fVar108) * 3.0;
                    local_2f8.context = context->user;
                    fVar148 = fVar148 * fVar148 * -3.0;
                    local_118 = fVar148 * local_338 +
                                fVar108 * fVar270 + fVar111 * fVar259 + fVar73 * fVar281;
                    local_108 = fVar148 * fStack_334 +
                                fVar108 * fVar271 + fVar111 * fVar262 + fVar73 * fVar282;
                    local_f8 = fVar148 * fStack_330 +
                               fVar108 * fVar272 + fVar111 * fVar269 + fVar73 * fVar283;
                    fStack_114 = local_118;
                    fStack_110 = local_118;
                    fStack_10c = local_118;
                    fStack_104 = local_108;
                    fStack_100 = local_108;
                    fStack_fc = local_108;
                    fStack_f4 = local_f8;
                    fStack_f0 = local_f8;
                    fStack_ec = local_f8;
                    fStack_e4 = local_e8;
                    fStack_e0 = local_e8;
                    fStack_dc = local_e8;
                    uStack_d4 = local_d8;
                    uStack_d0 = local_d8;
                    uStack_cc = local_d8;
                    local_c8 = CONCAT44(uStack_74,local_78);
                    uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                    local_b8 = local_2c8._0_8_;
                    uStack_b0 = local_2c8._8_8_;
                    local_a8 = (local_2f8.context)->instID[0];
                    uStack_a4 = local_a8;
                    uStack_a0 = local_a8;
                    uStack_9c = local_a8;
                    local_98 = (local_2f8.context)->instPrimID[0];
                    uStack_94 = local_98;
                    uStack_90 = local_98;
                    uStack_8c = local_98;
                    local_2f8.valid = (int *)&local_3c8;
                    local_2f8.geometryUserPtr = pGVar61->userPtr;
                    local_2f8.hit = (RTCHitN *)&local_118;
                    local_2f8.N = 4;
                    p_Var55 = pGVar61->occlusionFilterN;
                    local_3c8 = uVar24;
                    uStack_3c0 = uVar25;
                    local_2f8.ray = (RTCRayN *)ray;
                    if (p_Var55 != (RTCFilterFunctionN)0x0) {
                      p_Var55 = (RTCFilterFunctionN)(*p_Var55)(&local_2f8);
                    }
                    auVar102._0_4_ = -(uint)((int)local_3c8 == 0);
                    auVar102._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                    auVar102._8_4_ = -(uint)((int)uStack_3c0 == 0);
                    auVar102._12_4_ = -(uint)(uStack_3c0._4_4_ == 0);
                    uVar67 = movmskps((int)p_Var55,auVar102);
                    pRVar56 = (RTCRayN *)(ulong)(uVar67 ^ 0xf);
                    if ((uVar67 ^ 0xf) == 0) {
                      auVar102 = auVar102 ^ _DAT_01febe20;
                    }
                    else {
                      p_Var55 = context->args->filter;
                      if ((p_Var55 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar61->field_8).field_0x2 & 0x40) != 0)))) {
                        (*p_Var55)(&local_2f8);
                      }
                      auVar132._0_4_ = -(uint)((int)local_3c8 == 0);
                      auVar132._4_4_ = -(uint)(local_3c8._4_4_ == 0);
                      auVar132._8_4_ = -(uint)((int)uStack_3c0 == 0);
                      auVar132._12_4_ = -(uint)(uStack_3c0._4_4_ == 0);
                      auVar102 = auVar132 ^ _DAT_01febe20;
                      *(undefined1 (*) [16])(local_2f8.ray + 0x80) =
                           ~auVar132 & _DAT_01feba00 |
                           *(undefined1 (*) [16])(local_2f8.ray + 0x80) & auVar132;
                      pRVar56 = local_2f8.ray;
                    }
                    auVar103._0_4_ = auVar102._0_4_ << 0x1f;
                    auVar103._4_4_ = auVar102._4_4_ << 0x1f;
                    auVar103._8_4_ = auVar102._8_4_ << 0x1f;
                    auVar103._12_4_ = auVar102._12_4_ << 0x1f;
                    iVar52 = movmskps((int)pRVar56,auVar103);
                    if (iVar52 != 0) break;
                    *(undefined4 *)(ray + k * 4 + 0x80) = uVar57;
                    uVar63 = uVar63 ^ 1L << (uVar64 & 0x3f);
                    uVar64 = 0;
                    if (uVar63 != 0) {
                      for (; (uVar63 >> uVar64 & 1) == 0; uVar64 = uVar64 + 1) {
                      }
                    }
                    local_438._0_4_ = (uint)(uVar63 != 0);
                  } while (uVar63 != 0);
                  puVar59 = (undefined1 *)(ulong)(uint)local_438;
                }
                bVar65 = (bool)(bVar65 | (byte)puVar59);
              }
            }
          }
          uVar57 = SUB84(puVar59,0);
          lVar62 = lVar62 + 4;
        } while ((int)lVar62 < iVar17);
      }
      if (bVar65 != false) {
        return local_4f9;
      }
      fVar148 = *(float *)(ray + k * 4 + 0x80);
      auVar130._4_4_ = -(uint)(fStack_44 <= fVar148);
      auVar130._0_4_ = -(uint)(local_48 <= fVar148);
      auVar130._8_4_ = -(uint)(fStack_40 <= fVar148);
      auVar130._12_4_ = -(uint)(fStack_3c <= fVar148);
      uVar67 = movmskps(uVar57,auVar130);
      uVar66 = uVar66 & uVar66 + 0xf & uVar67;
      local_4f9 = uVar66 != 0;
    } while (local_4f9);
  }
  return local_4f9;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }